

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_h<embree::sse2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  Primitive *pPVar2;
  undefined1 (*pauVar3) [12];
  anon_struct_4_6_abad0318_for_Geometry_10 aVar4;
  Primitive PVar5;
  int iVar6;
  Geometry *pGVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  float *pfVar11;
  RTCFeatureFlags RVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined6 uVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  __int_type_conflict _Var38;
  int iVar39;
  ulong uVar40;
  ulong uVar41;
  RTCFilterFunctionN p_Var42;
  RayHitK<4> *pRVar43;
  Device *pDVar44;
  int iVar45;
  undefined4 uVar46;
  ulong uVar47;
  RTCIntersectArguments *pRVar49;
  long lVar50;
  ulong uVar51;
  long lVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  short sVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined2 uVar99;
  float fVar100;
  float fVar103;
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  float fVar101;
  float fVar104;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  float fVar102;
  float fVar105;
  undefined8 uVar106;
  float fVar107;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar108;
  float fVar133;
  float fVar134;
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar135;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar136;
  float fVar137;
  float fVar147;
  float fVar149;
  vfloat4 v;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar148;
  float fVar150;
  float fVar151;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar152;
  float fVar165;
  float fVar168;
  undefined1 auVar155 [16];
  float fVar153;
  float fVar154;
  float fVar166;
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar173;
  float fVar174;
  float fVar184;
  float fVar186;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar185;
  float fVar187;
  float fVar188;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar189;
  float fVar204;
  float fVar205;
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar207;
  float fVar212;
  float fVar214;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar213;
  float fVar215;
  float fVar216;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar217;
  float fVar218;
  float fVar234;
  float fVar236;
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar233 [16];
  float fVar241;
  float fVar245;
  float fVar246;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar247;
  float fVar249;
  float fVar250;
  undefined1 auVar248 [16];
  float fVar251;
  float fVar252;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar260;
  float fVar261;
  float fVar267;
  float fVar268;
  undefined1 auVar262 [16];
  float fVar269;
  undefined1 auVar265 [16];
  float fVar270;
  undefined1 auVar266 [16];
  float fVar271;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar279;
  undefined1 auVar275 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar284;
  float fVar285;
  float fVar288;
  float fVar290;
  float fVar292;
  undefined1 auVar286 [16];
  float fVar289;
  float fVar291;
  float fVar293;
  undefined1 auVar287 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  undefined8 local_498;
  uint uStack_490;
  uint uStack_48c;
  float local_428;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_368 [16];
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  RTCFilterFunctionNArguments local_2f8;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined8 *local_290;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  uint local_1d8;
  int local_1d4;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  anon_struct_4_6_abad0318_for_Geometry_10 local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158 [4];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  anon_struct_4_6_abad0318_for_Geometry_10 local_d8;
  anon_struct_4_6_abad0318_for_Geometry_10 aStack_d4;
  anon_struct_4_6_abad0318_for_Geometry_10 aStack_d0;
  anon_struct_4_6_abad0318_for_Geometry_10 aStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  RTCPointQueryFunction local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  Geometry *pGVar48;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 uVar98;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  
  PVar5 = prim[1];
  uVar40 = (ulong)(byte)PVar5;
  pPVar2 = prim + uVar40 * 0x19 + 6;
  fVar149 = *(float *)(pPVar2 + 0xc);
  fVar152 = (*(float *)(ray + k * 4) - *(float *)pPVar2) * fVar149;
  fVar165 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar2 + 4)) * fVar149;
  fVar168 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar2 + 8)) * fVar149;
  fVar136 = *(float *)(ray + k * 4 + 0x40) * fVar149;
  fVar147 = *(float *)(ray + k * 4 + 0x50) * fVar149;
  fVar149 = *(float *)(ray + k * 4 + 0x60) * fVar149;
  uVar46 = *(undefined4 *)(prim + uVar40 * 4 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar16 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar46,(char)uVar46);
  uVar41 = CONCAT62(uVar16,sVar60);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar41;
  auVar73._12_2_ = uVar99;
  auVar73._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar195._12_4_ = auVar73._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar41;
  auVar195._10_2_ = uVar99;
  auVar196._10_6_ = auVar195._10_6_;
  auVar196._8_2_ = uVar99;
  auVar196._0_8_ = uVar41;
  uVar99 = (undefined2)uVar16;
  auVar17._4_8_ = auVar196._8_8_;
  auVar17._2_2_ = uVar99;
  auVar17._0_2_ = uVar99;
  fVar108 = (float)((int)sVar60 >> 8);
  fVar133 = (float)(auVar17._0_4_ >> 0x18);
  fVar134 = (float)(auVar196._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar40 * 5 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar16 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar46,(char)uVar46);
  uVar41 = CONCAT62(uVar16,sVar60);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar41;
  auVar66._12_2_ = uVar99;
  auVar66._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar41;
  auVar65._10_2_ = uVar99;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar99;
  auVar64._0_8_ = uVar41;
  uVar99 = (undefined2)uVar16;
  auVar18._4_8_ = auVar64._8_8_;
  auVar18._2_2_ = uVar99;
  auVar18._0_2_ = uVar99;
  fVar173 = (float)((int)sVar60 >> 8);
  fVar184 = (float)(auVar18._0_4_ >> 0x18);
  fVar186 = (float)(auVar64._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar40 * 6 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar16 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar46,(char)uVar46);
  uVar41 = CONCAT62(uVar16,sVar60);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar41;
  auVar69._12_2_ = uVar99;
  auVar69._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar41;
  auVar68._10_2_ = uVar99;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar99;
  auVar67._0_8_ = uVar41;
  uVar99 = (undefined2)uVar16;
  auVar19._4_8_ = auVar67._8_8_;
  auVar19._2_2_ = uVar99;
  auVar19._0_2_ = uVar99;
  fVar206 = (float)((int)sVar60 >> 8);
  fVar212 = (float)(auVar19._0_4_ >> 0x18);
  fVar214 = (float)(auVar67._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar40 * 0xb + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar16 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar46,(char)uVar46);
  uVar41 = CONCAT62(uVar16,sVar60);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar41;
  auVar72._12_2_ = uVar99;
  auVar72._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar41;
  auVar71._10_2_ = uVar99;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar99;
  auVar70._0_8_ = uVar41;
  uVar99 = (undefined2)uVar16;
  auVar20._4_8_ = auVar70._8_8_;
  auVar20._2_2_ = uVar99;
  auVar20._0_2_ = uVar99;
  fVar61 = (float)((int)sVar60 >> 8);
  fVar100 = (float)(auVar20._0_4_ >> 0x18);
  fVar103 = (float)(auVar70._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar16 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar46,(char)uVar46);
  uVar41 = CONCAT62(uVar16,sVar60);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar41;
  auVar192._12_2_ = uVar99;
  auVar192._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar41;
  auVar191._10_2_ = uVar99;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar99;
  auVar190._0_8_ = uVar41;
  uVar99 = (undefined2)uVar16;
  auVar21._4_8_ = auVar190._8_8_;
  auVar21._2_2_ = uVar99;
  auVar21._0_2_ = uVar99;
  fVar189 = (float)((int)sVar60 >> 8);
  fVar204 = (float)(auVar21._0_4_ >> 0x18);
  fVar205 = (float)(auVar190._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar40 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar16 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar46,(char)uVar46);
  uVar41 = CONCAT62(uVar16,sVar60);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar41;
  auVar221._12_2_ = uVar99;
  auVar221._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar41;
  auVar220._10_2_ = uVar99;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar99;
  auVar219._0_8_ = uVar41;
  uVar99 = (undefined2)uVar16;
  auVar22._4_8_ = auVar219._8_8_;
  auVar22._2_2_ = uVar99;
  auVar22._0_2_ = uVar99;
  fVar247 = (float)((int)sVar60 >> 8);
  fVar249 = (float)(auVar22._0_4_ >> 0x18);
  fVar250 = (float)(auVar219._8_4_ >> 0x18);
  uVar51 = (ulong)(uint)((int)(uVar40 * 9) * 2);
  uVar46 = *(undefined4 *)(prim + uVar51 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar16 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar46,(char)uVar46);
  uVar41 = CONCAT62(uVar16,sVar60);
  auVar224._8_4_ = 0;
  auVar224._0_8_ = uVar41;
  auVar224._12_2_ = uVar99;
  auVar224._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar223._12_4_ = auVar224._12_4_;
  auVar223._8_2_ = 0;
  auVar223._0_8_ = uVar41;
  auVar223._10_2_ = uVar99;
  auVar222._10_6_ = auVar223._10_6_;
  auVar222._8_2_ = uVar99;
  auVar222._0_8_ = uVar41;
  uVar99 = (undefined2)uVar16;
  auVar23._4_8_ = auVar222._8_8_;
  auVar23._2_2_ = uVar99;
  auVar23._0_2_ = uVar99;
  fVar241 = (float)((int)sVar60 >> 8);
  fVar245 = (float)(auVar23._0_4_ >> 0x18);
  fVar246 = (float)(auVar222._8_4_ >> 0x18);
  uVar46 = *(undefined4 *)(prim + uVar51 + uVar40 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar16 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar46,(char)uVar46);
  uVar41 = CONCAT62(uVar16,sVar60);
  auVar227._8_4_ = 0;
  auVar227._0_8_ = uVar41;
  auVar227._12_2_ = uVar99;
  auVar227._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar41;
  auVar226._10_2_ = uVar99;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._8_2_ = uVar99;
  auVar225._0_8_ = uVar41;
  uVar99 = (undefined2)uVar16;
  auVar24._4_8_ = auVar225._8_8_;
  auVar24._2_2_ = uVar99;
  auVar24._0_2_ = uVar99;
  fVar251 = (float)((int)sVar60 >> 8);
  fVar256 = (float)(auVar24._0_4_ >> 0x18);
  fVar258 = (float)(auVar225._8_4_ >> 0x18);
  uVar47 = (ulong)(uint)((int)(uVar40 * 5) << 2);
  uVar46 = *(undefined4 *)(prim + uVar47 + 6);
  uVar98 = (undefined1)((uint)uVar46 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar46 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar46));
  uVar98 = (undefined1)((uint)uVar46 >> 8);
  uVar16 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar98),uVar98);
  sVar60 = CONCAT11((char)uVar46,(char)uVar46);
  uVar41 = CONCAT62(uVar16,sVar60);
  auVar264._8_4_ = 0;
  auVar264._0_8_ = uVar41;
  auVar264._12_2_ = uVar99;
  auVar264._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar263._12_4_ = auVar264._12_4_;
  auVar263._8_2_ = 0;
  auVar263._0_8_ = uVar41;
  auVar263._10_2_ = uVar99;
  auVar262._10_6_ = auVar263._10_6_;
  auVar262._8_2_ = uVar99;
  auVar262._0_8_ = uVar41;
  uVar99 = (undefined2)uVar16;
  auVar25._4_8_ = auVar262._8_8_;
  auVar25._2_2_ = uVar99;
  auVar25._0_2_ = uVar99;
  fVar62 = (float)((int)sVar60 >> 8);
  fVar101 = (float)(auVar25._0_4_ >> 0x18);
  fVar104 = (float)(auVar262._8_4_ >> 0x18);
  fVar271 = fVar136 * fVar108 + fVar147 * fVar173 + fVar149 * fVar206;
  fVar276 = fVar136 * fVar133 + fVar147 * fVar184 + fVar149 * fVar212;
  fVar277 = fVar136 * fVar134 + fVar147 * fVar186 + fVar149 * fVar214;
  fVar278 = fVar136 * (float)(auVar195._12_4_ >> 0x18) +
            fVar147 * (float)(auVar65._12_4_ >> 0x18) + fVar149 * (float)(auVar68._12_4_ >> 0x18);
  fVar261 = fVar136 * fVar61 + fVar147 * fVar189 + fVar149 * fVar247;
  fVar267 = fVar136 * fVar100 + fVar147 * fVar204 + fVar149 * fVar249;
  fVar268 = fVar136 * fVar103 + fVar147 * fVar205 + fVar149 * fVar250;
  fVar269 = fVar136 * (float)(auVar71._12_4_ >> 0x18) +
            fVar147 * (float)(auVar191._12_4_ >> 0x18) + fVar149 * (float)(auVar220._12_4_ >> 0x18);
  fVar217 = fVar136 * fVar241 + fVar147 * fVar251 + fVar149 * fVar62;
  fVar234 = fVar136 * fVar245 + fVar147 * fVar256 + fVar149 * fVar101;
  fVar236 = fVar136 * fVar246 + fVar147 * fVar258 + fVar149 * fVar104;
  fVar136 = fVar136 * (float)(auVar223._12_4_ >> 0x18) +
            fVar147 * (float)(auVar226._12_4_ >> 0x18) + fVar149 * (float)(auVar263._12_4_ >> 0x18);
  uVar46 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar173 = fVar108 * fVar152 + fVar173 * fVar165 + fVar206 * fVar168;
  fVar184 = fVar133 * fVar152 + fVar184 * fVar165 + fVar212 * fVar168;
  fVar186 = fVar134 * fVar152 + fVar186 * fVar165 + fVar214 * fVar168;
  fVar206 = (float)(auVar195._12_4_ >> 0x18) * fVar152 +
            (float)(auVar65._12_4_ >> 0x18) * fVar165 + (float)(auVar68._12_4_ >> 0x18) * fVar168;
  fVar212 = fVar61 * fVar152 + fVar189 * fVar165 + fVar247 * fVar168;
  fVar214 = fVar100 * fVar152 + fVar204 * fVar165 + fVar249 * fVar168;
  fVar247 = fVar103 * fVar152 + fVar205 * fVar165 + fVar250 * fVar168;
  fVar249 = (float)(auVar71._12_4_ >> 0x18) * fVar152 +
            (float)(auVar191._12_4_ >> 0x18) * fVar165 + (float)(auVar220._12_4_ >> 0x18) * fVar168;
  fVar189 = fVar152 * fVar241 + fVar165 * fVar251 + fVar168 * fVar62;
  fVar204 = fVar152 * fVar245 + fVar165 * fVar256 + fVar168 * fVar101;
  fVar205 = fVar152 * fVar246 + fVar165 * fVar258 + fVar168 * fVar104;
  fVar152 = fVar152 * (float)(auVar223._12_4_ >> 0x18) +
            fVar165 * (float)(auVar226._12_4_ >> 0x18) + fVar168 * (float)(auVar263._12_4_ >> 0x18);
  fVar149 = (float)DAT_01ff1d40;
  fVar61 = DAT_01ff1d40._4_4_;
  fVar62 = DAT_01ff1d40._8_4_;
  fVar100 = DAT_01ff1d40._12_4_;
  uVar53 = -(uint)(fVar149 <= ABS(fVar271));
  uVar54 = -(uint)(fVar61 <= ABS(fVar276));
  uVar56 = -(uint)(fVar62 <= ABS(fVar277));
  uVar58 = -(uint)(fVar100 <= ABS(fVar278));
  auVar272._0_4_ = (uint)fVar271 & uVar53;
  auVar272._4_4_ = (uint)fVar276 & uVar54;
  auVar272._8_4_ = (uint)fVar277 & uVar56;
  auVar272._12_4_ = (uint)fVar278 & uVar58;
  auVar175._0_4_ = ~uVar53 & (uint)fVar149;
  auVar175._4_4_ = ~uVar54 & (uint)fVar61;
  auVar175._8_4_ = ~uVar56 & (uint)fVar62;
  auVar175._12_4_ = ~uVar58 & (uint)fVar100;
  auVar175 = auVar175 | auVar272;
  uVar53 = -(uint)(fVar149 <= ABS(fVar261));
  uVar54 = -(uint)(fVar61 <= ABS(fVar267));
  uVar56 = -(uint)(fVar62 <= ABS(fVar268));
  uVar58 = -(uint)(fVar100 <= ABS(fVar269));
  auVar265._0_4_ = (uint)fVar261 & uVar53;
  auVar265._4_4_ = (uint)fVar267 & uVar54;
  auVar265._8_4_ = (uint)fVar268 & uVar56;
  auVar265._12_4_ = (uint)fVar269 & uVar58;
  auVar193._0_4_ = ~uVar53 & (uint)fVar149;
  auVar193._4_4_ = ~uVar54 & (uint)fVar61;
  auVar193._8_4_ = ~uVar56 & (uint)fVar62;
  auVar193._12_4_ = ~uVar58 & (uint)fVar100;
  auVar193 = auVar193 | auVar265;
  uVar53 = -(uint)(fVar149 <= ABS(fVar217));
  uVar54 = -(uint)(fVar61 <= ABS(fVar234));
  uVar56 = -(uint)(fVar62 <= ABS(fVar236));
  uVar58 = -(uint)(fVar100 <= ABS(fVar136));
  auVar228._0_4_ = (uint)fVar217 & uVar53;
  auVar228._4_4_ = (uint)fVar234 & uVar54;
  auVar228._8_4_ = (uint)fVar236 & uVar56;
  auVar228._12_4_ = (uint)fVar136 & uVar58;
  auVar208._0_4_ = ~uVar53 & (uint)fVar149;
  auVar208._4_4_ = ~uVar54 & (uint)fVar61;
  auVar208._8_4_ = ~uVar56 & (uint)fVar62;
  auVar208._12_4_ = ~uVar58 & (uint)fVar100;
  auVar208 = auVar208 | auVar228;
  auVar73 = rcpps(_DAT_01ff1d40,auVar175);
  fVar149 = auVar73._0_4_;
  fVar100 = auVar73._4_4_;
  fVar104 = auVar73._8_4_;
  fVar134 = auVar73._12_4_;
  fVar149 = (1.0 - auVar175._0_4_ * fVar149) * fVar149 + fVar149;
  fVar100 = (1.0 - auVar175._4_4_ * fVar100) * fVar100 + fVar100;
  fVar104 = (1.0 - auVar175._8_4_ * fVar104) * fVar104 + fVar104;
  fVar134 = (1.0 - auVar175._12_4_ * fVar134) * fVar134 + fVar134;
  auVar73 = rcpps(auVar73,auVar193);
  fVar61 = auVar73._0_4_;
  fVar101 = auVar73._4_4_;
  fVar108 = auVar73._8_4_;
  fVar136 = auVar73._12_4_;
  fVar61 = (1.0 - auVar193._0_4_ * fVar61) * fVar61 + fVar61;
  fVar101 = (1.0 - auVar193._4_4_ * fVar101) * fVar101 + fVar101;
  fVar108 = (1.0 - auVar193._8_4_ * fVar108) * fVar108 + fVar108;
  fVar136 = (1.0 - auVar193._12_4_ * fVar136) * fVar136 + fVar136;
  auVar73 = rcpps(auVar73,auVar208);
  fVar62 = auVar73._0_4_;
  fVar103 = auVar73._4_4_;
  fVar133 = auVar73._8_4_;
  fVar147 = auVar73._12_4_;
  fVar62 = (1.0 - auVar208._0_4_ * fVar62) * fVar62 + fVar62;
  fVar103 = (1.0 - auVar208._4_4_ * fVar103) * fVar103 + fVar103;
  fVar133 = (1.0 - auVar208._8_4_ * fVar133) * fVar133 + fVar133;
  fVar147 = (1.0 - auVar208._12_4_ * fVar147) * fVar147 + fVar147;
  uVar41 = *(ulong *)(prim + uVar40 * 7 + 6);
  uVar99 = (undefined2)(uVar41 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar41;
  auVar76._12_2_ = uVar99;
  auVar76._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar41 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar41;
  auVar75._10_2_ = uVar99;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar99;
  auVar74._0_8_ = uVar41;
  uVar99 = (undefined2)(uVar41 >> 0x10);
  auVar26._4_8_ = auVar74._8_8_;
  auVar26._2_2_ = uVar99;
  auVar26._0_2_ = uVar99;
  auVar176._0_8_ =
       CONCAT44(((float)(auVar26._0_4_ >> 0x10) - fVar184) * fVar100,
                ((float)(int)(short)uVar41 - fVar173) * fVar149);
  auVar176._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar186) * fVar104;
  auVar176._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar206) * fVar134;
  uVar41 = *(ulong *)(prim + uVar40 * 9 + 6);
  uVar99 = (undefined2)(uVar41 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar41;
  auVar79._12_2_ = uVar99;
  auVar79._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar41 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar41;
  auVar78._10_2_ = uVar99;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar99;
  auVar77._0_8_ = uVar41;
  uVar99 = (undefined2)(uVar41 >> 0x10);
  auVar27._4_8_ = auVar77._8_8_;
  auVar27._2_2_ = uVar99;
  auVar27._0_2_ = uVar99;
  auVar209._0_4_ = ((float)(int)(short)uVar41 - fVar173) * fVar149;
  auVar209._4_4_ = ((float)(auVar27._0_4_ >> 0x10) - fVar184) * fVar100;
  auVar209._8_4_ = ((float)(auVar77._8_4_ >> 0x10) - fVar186) * fVar104;
  auVar209._12_4_ = ((float)(auVar78._12_4_ >> 0x10) - fVar206) * fVar134;
  uVar41 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar51 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar40 * -2 + 6);
  uVar99 = (undefined2)(uVar51 >> 0x30);
  auVar111._8_4_ = 0;
  auVar111._0_8_ = uVar51;
  auVar111._12_2_ = uVar99;
  auVar111._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar51 >> 0x20);
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._8_2_ = 0;
  auVar110._0_8_ = uVar51;
  auVar110._10_2_ = uVar99;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._8_2_ = uVar99;
  auVar109._0_8_ = uVar51;
  uVar99 = (undefined2)(uVar51 >> 0x10);
  auVar28._4_8_ = auVar109._8_8_;
  auVar28._2_2_ = uVar99;
  auVar28._0_2_ = uVar99;
  auVar112._0_8_ =
       CONCAT44(((float)(auVar28._0_4_ >> 0x10) - fVar214) * fVar101,
                ((float)(int)(short)uVar51 - fVar212) * fVar61);
  auVar112._8_4_ = ((float)(auVar109._8_4_ >> 0x10) - fVar247) * fVar108;
  auVar112._12_4_ = ((float)(auVar110._12_4_ >> 0x10) - fVar249) * fVar136;
  uVar99 = (undefined2)(uVar41 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar41;
  auVar82._12_2_ = uVar99;
  auVar82._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar41 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar41;
  auVar81._10_2_ = uVar99;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar99;
  auVar80._0_8_ = uVar41;
  uVar99 = (undefined2)(uVar41 >> 0x10);
  auVar29._4_8_ = auVar80._8_8_;
  auVar29._2_2_ = uVar99;
  auVar29._0_2_ = uVar99;
  auVar242._0_4_ = ((float)(int)(short)uVar41 - fVar212) * fVar61;
  auVar242._4_4_ = ((float)(auVar29._0_4_ >> 0x10) - fVar214) * fVar101;
  auVar242._8_4_ = ((float)(auVar80._8_4_ >> 0x10) - fVar247) * fVar108;
  auVar242._12_4_ = ((float)(auVar81._12_4_ >> 0x10) - fVar249) * fVar136;
  uVar41 = *(ulong *)(prim + uVar47 + uVar40 + 6);
  uVar99 = (undefined2)(uVar41 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar41;
  auVar85._12_2_ = uVar99;
  auVar85._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar41 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar41;
  auVar84._10_2_ = uVar99;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar99;
  auVar83._0_8_ = uVar41;
  uVar99 = (undefined2)(uVar41 >> 0x10);
  auVar30._4_8_ = auVar83._8_8_;
  auVar30._2_2_ = uVar99;
  auVar30._0_2_ = uVar99;
  auVar86._0_8_ =
       CONCAT44(((float)(auVar30._0_4_ >> 0x10) - fVar204) * fVar103,
                ((float)(int)(short)uVar41 - fVar189) * fVar62);
  auVar86._8_4_ = ((float)(auVar83._8_4_ >> 0x10) - fVar205) * fVar133;
  auVar86._12_4_ = ((float)(auVar84._12_4_ >> 0x10) - fVar152) * fVar147;
  uVar41 = *(ulong *)(prim + uVar40 * 0x17 + 6);
  uVar99 = (undefined2)(uVar41 >> 0x30);
  auVar231._8_4_ = 0;
  auVar231._0_8_ = uVar41;
  auVar231._12_2_ = uVar99;
  auVar231._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar41 >> 0x20);
  auVar230._12_4_ = auVar231._12_4_;
  auVar230._8_2_ = 0;
  auVar230._0_8_ = uVar41;
  auVar230._10_2_ = uVar99;
  auVar229._10_6_ = auVar230._10_6_;
  auVar229._8_2_ = uVar99;
  auVar229._0_8_ = uVar41;
  uVar99 = (undefined2)(uVar41 >> 0x10);
  auVar31._4_8_ = auVar229._8_8_;
  auVar31._2_2_ = uVar99;
  auVar31._0_2_ = uVar99;
  auVar232._0_4_ = ((float)(int)(short)uVar41 - fVar189) * fVar62;
  auVar232._4_4_ = ((float)(auVar31._0_4_ >> 0x10) - fVar204) * fVar103;
  auVar232._8_4_ = ((float)(auVar229._8_4_ >> 0x10) - fVar205) * fVar133;
  auVar232._12_4_ = ((float)(auVar230._12_4_ >> 0x10) - fVar152) * fVar147;
  auVar194._8_4_ = auVar176._8_4_;
  auVar194._0_8_ = auVar176._0_8_;
  auVar194._12_4_ = auVar176._12_4_;
  auVar195 = minps(auVar194,auVar209);
  auVar138._8_4_ = auVar112._8_4_;
  auVar138._0_8_ = auVar112._0_8_;
  auVar138._12_4_ = auVar112._12_4_;
  auVar73 = minps(auVar138,auVar242);
  auVar195 = maxps(auVar195,auVar73);
  auVar139._8_4_ = auVar86._8_4_;
  auVar139._0_8_ = auVar86._0_8_;
  auVar139._12_4_ = auVar86._12_4_;
  auVar73 = minps(auVar139,auVar232);
  auVar155._4_4_ = uVar46;
  auVar155._0_4_ = uVar46;
  auVar155._8_4_ = uVar46;
  auVar155._12_4_ = uVar46;
  auVar73 = maxps(auVar73,auVar155);
  auVar196 = maxps(auVar195,auVar73);
  auVar195 = maxps(auVar176,auVar209);
  auVar73 = maxps(auVar112,auVar242);
  auVar195 = minps(auVar195,auVar73);
  local_48 = auVar196._0_4_ * 0.99999964;
  fStack_44 = auVar196._4_4_ * 0.99999964;
  fStack_40 = auVar196._8_4_ * 0.99999964;
  fStack_3c = auVar196._12_4_ * 0.99999964;
  auVar73 = maxps(auVar86,auVar232);
  uVar46 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar113._4_4_ = uVar46;
  auVar113._0_4_ = uVar46;
  auVar113._8_4_ = uVar46;
  auVar113._12_4_ = uVar46;
  auVar73 = minps(auVar73,auVar113);
  auVar73 = minps(auVar195,auVar73);
  auVar114._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_48 <= auVar73._0_4_ * 1.0000004);
  auVar114._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_44 <= auVar73._4_4_ * 1.0000004);
  auVar114._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_40 <= auVar73._8_4_ * 1.0000004);
  auVar114._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_3c <= auVar73._12_4_ * 1.0000004);
  uVar53 = movmskps((uint)(byte)PVar5,auVar114);
  if (uVar53 != 0) {
    uVar53 = uVar53 & 0xff;
    local_328 = mm_lookupmask_ps._0_8_;
    uStack_320 = mm_lookupmask_ps._8_8_;
    local_290 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      lVar8 = 0;
      if (uVar53 != 0) {
        for (; (uVar53 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
        }
      }
      uVar54 = *(uint *)(prim + 2);
      uVar56 = *(uint *)(prim + lVar8 * 4 + 6);
      pGVar48 = (context->scene->geometries).items[uVar54].ptr;
      lVar8 = *(long *)&pGVar48[1].time_range.upper;
      uVar41 = (ulong)*(uint *)(*(long *)&pGVar48->field_0x58 +
                               (ulong)uVar56 *
                               pGVar48[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      pfVar1 = (float *)(lVar8 + (long)pGVar48[1].intersectionFilterN * uVar41);
      fVar100 = *pfVar1;
      fVar101 = pfVar1[1];
      uVar36 = *(undefined8 *)pfVar1;
      local_1c8 = *(undefined8 *)pfVar1;
      pfVar11 = pfVar1 + 2;
      fVar103 = *pfVar11;
      local_148 = pfVar1[3];
      uVar37 = *(undefined8 *)pfVar11;
      uStack_1c0 = *(undefined8 *)pfVar11;
      pfVar1 = (float *)(lVar8 + (long)pGVar48[1].intersectionFilterN * (uVar41 + 1));
      local_258 = *pfVar1;
      fStack_254 = pfVar1[1];
      uVar10 = *(undefined8 *)pfVar1;
      fStack_250 = pfVar1[2];
      fStack_24c = pfVar1[3];
      uVar13 = *(undefined8 *)(pfVar1 + 2);
      iVar6 = (int)pGVar48[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar149 = *(float *)(ray + k * 4);
      fVar61 = *(float *)(ray + k * 4 + 0x10);
      fVar62 = *(float *)(ray + k * 4 + 0x20);
      pfVar1 = (float *)(pGVar48[2].intersectionFilterN + uVar41 * (long)pGVar48[2].pointQueryFunc);
      fVar165 = *pfVar1 * 0.33333334 + fVar100;
      fVar168 = pfVar1[1] * 0.33333334 + fVar101;
      fVar212 = pfVar1[2] * 0.33333334 + fVar103;
      fStack_25c = pfVar1[3] * 0.33333334 + local_148;
      pfVar1 = (float *)(pGVar48[2].intersectionFilterN +
                        (long)pGVar48[2].pointQueryFunc * (uVar41 + 1));
      fVar214 = local_258 - *pfVar1 * 0.33333334;
      fVar217 = fStack_254 - pfVar1[1] * 0.33333334;
      fVar234 = fStack_250 - pfVar1[2] * 0.33333334;
      fStack_26c = fStack_24c - pfVar1[3] * 0.33333334;
      fVar206 = fVar100 - fVar149;
      fVar189 = fVar101 - fVar61;
      fVar204 = fVar103 - fVar62;
      fVar104 = pre->ray_space[k].vx.field_0.m128[0];
      fVar108 = pre->ray_space[k].vx.field_0.m128[1];
      fVar133 = pre->ray_space[k].vx.field_0.m128[2];
      fVar134 = pre->ray_space[k].vy.field_0.m128[0];
      fVar136 = pre->ray_space[k].vy.field_0.m128[1];
      fVar147 = pre->ray_space[k].vy.field_0.m128[2];
      fVar173 = pre->ray_space[k].vz.field_0.m128[0];
      fVar184 = pre->ray_space[k].vz.field_0.m128[1];
      fVar186 = pre->ray_space[k].vz.field_0.m128[2];
      local_2b8 = fVar206 * fVar104 + fVar189 * fVar134 + fVar204 * fVar173;
      local_248 = fVar206 * fVar108 + fVar189 * fVar136 + fVar204 * fVar184;
      fVar205 = fVar206 * fVar133 + fVar189 * fVar147 + fVar204 * fVar186;
      fVar206 = fVar165 - fVar149;
      fVar189 = fVar168 - fVar61;
      fVar204 = fVar212 - fVar62;
      local_2a8 = fVar206 * fVar104 + fVar189 * fVar134 + fVar204 * fVar173;
      local_308 = fVar206 * fVar108 + fVar189 * fVar136 + fVar204 * fVar184;
      fVar152 = fVar206 * fVar133 + fVar189 * fVar147 + fVar204 * fVar186;
      fVar206 = fVar214 - fVar149;
      fVar189 = fVar217 - fVar61;
      fVar204 = fVar234 - fVar62;
      fVar236 = fVar206 * fVar104 + fVar189 * fVar134 + fVar204 * fVar173;
      fVar241 = fVar206 * fVar108 + fVar189 * fVar136 + fVar204 * fVar184;
      local_228 = fVar206 * fVar133 + fVar189 * fVar147 + fVar204 * fVar186;
      fVar149 = local_258 - fVar149;
      fVar61 = fStack_254 - fVar61;
      fVar62 = fStack_250 - fVar62;
      fVar104 = fVar149 * fVar104 + fVar61 * fVar134 + fVar62 * fVar173;
      fVar108 = fVar149 * fVar108 + fVar61 * fVar136 + fVar62 * fVar184;
      local_238 = fVar149 * fVar133 + fVar61 * fVar147 + fVar62 * fVar186;
      auVar253._0_8_ = CONCAT44(local_248,local_2b8) & 0x7fffffff7fffffff;
      auVar253._8_4_ = ABS(fVar205);
      auVar253._12_4_ = ABS(local_148);
      auVar177._0_8_ = CONCAT44(local_308,local_2a8) & 0x7fffffff7fffffff;
      auVar177._8_4_ = ABS(fVar152);
      auVar177._12_4_ = ABS(fStack_25c);
      auVar195 = maxps(auVar253,auVar177);
      auVar197._0_8_ = CONCAT44(fVar241,fVar236) & 0x7fffffff7fffffff;
      auVar197._8_4_ = ABS(local_228);
      auVar197._12_4_ = ABS(fStack_26c);
      auVar115._0_8_ = CONCAT44(fVar108,fVar104) & 0x7fffffff7fffffff;
      auVar115._8_4_ = ABS(local_238);
      auVar115._12_4_ = ABS(fStack_24c);
      auVar73 = maxps(auVar197,auVar115);
      auVar73 = maxps(auVar195,auVar73);
      uVar106 = auVar73._8_8_;
      fVar149 = auVar73._4_4_;
      if (auVar73._4_4_ <= auVar73._0_4_) {
        fVar149 = auVar73._0_4_;
      }
      auVar254._8_8_ = uVar106;
      auVar254._0_8_ = uVar106;
      fVar61 = (float)iVar6;
      _local_288 = ZEXT416((uint)fVar61);
      if (auVar73._8_4_ <= fVar149) {
        auVar255._4_12_ = auVar254._4_12_;
        auVar255._0_4_ = fVar149;
        uVar106 = auVar255._0_8_;
      }
      iVar45 = iVar6 * 0x40;
      lVar8 = (long)iVar6 * 0x44;
      fVar62 = *(float *)(bezier_basis0 + lVar8 + 0x908);
      fVar133 = *(float *)(bezier_basis0 + lVar8 + 0x90c);
      fVar134 = *(float *)(bezier_basis0 + lVar8 + 0x910);
      fVar136 = *(float *)(bezier_basis0 + lVar8 + 0x914);
      fVar147 = *(float *)(bezier_basis0 + lVar8 + 0xd8c);
      fVar173 = *(float *)(bezier_basis0 + lVar8 + 0xd90);
      fVar184 = *(float *)(bezier_basis0 + lVar8 + 0xd94);
      fVar186 = *(float *)(bezier_basis0 + lVar8 + 0xd98);
      fVar206 = *(float *)(bezier_basis0 + lVar8 + 0x484);
      fVar189 = *(float *)(bezier_basis0 + lVar8 + 0x488);
      fVar204 = *(float *)(bezier_basis0 + lVar8 + 0x48c);
      fVar245 = *(float *)(bezier_basis0 + lVar8 + 0x490);
      fVar246 = *(float *)(bezier_basis0 + lVar8);
      fVar247 = *(float *)(bezier_basis0 + lVar8 + 4);
      fVar249 = *(float *)(bezier_basis0 + lVar8 + 8);
      fVar250 = *(float *)(bezier_basis0 + lVar8 + 0xc);
      fVar153 = local_2b8 * fVar246 + local_2a8 * fVar206 + fVar236 * fVar62 + fVar104 * fVar147;
      fVar166 = local_2b8 * fVar247 + local_2a8 * fVar189 + fVar236 * fVar133 + fVar104 * fVar173;
      fVar169 = local_2b8 * fVar249 + local_2a8 * fVar204 + fVar236 * fVar134 + fVar104 * fVar184;
      fVar171 = local_2b8 * fVar250 + local_2a8 * fVar245 + fVar236 * fVar136 + fVar104 * fVar186;
      local_2c8._0_4_ =
           local_248 * fVar246 + local_308 * fVar206 + fVar241 * fVar62 + fVar108 * fVar147;
      local_2c8._4_4_ =
           local_248 * fVar247 + local_308 * fVar189 + fVar241 * fVar133 + fVar108 * fVar173;
      fStack_2c0 = local_248 * fVar249 + local_308 * fVar204 + fVar241 * fVar134 + fVar108 * fVar184
      ;
      fStack_2bc = local_248 * fVar250 + local_308 * fVar245 + fVar241 * fVar136 + fVar108 * fVar186
      ;
      auVar273._0_4_ =
           local_148 * fVar246 + fStack_25c * fVar206 + fStack_26c * fVar62 + fStack_24c * fVar147;
      auVar273._4_4_ =
           local_148 * fVar247 + fStack_25c * fVar189 + fStack_26c * fVar133 + fStack_24c * fVar173;
      auVar273._8_4_ =
           local_148 * fVar249 + fStack_25c * fVar204 + fStack_26c * fVar134 + fStack_24c * fVar184;
      auVar273._12_4_ =
           local_148 * fVar250 + fStack_25c * fVar245 + fStack_26c * fVar136 + fStack_24c * fVar186;
      fVar251 = *(float *)(bezier_basis1 + lVar8 + 0xd8c);
      fVar256 = *(float *)(bezier_basis1 + lVar8 + 0xd90);
      fVar258 = *(float *)(bezier_basis1 + lVar8 + 0xd94);
      fVar261 = *(float *)(bezier_basis1 + lVar8 + 0xd98);
      fVar267 = *(float *)(bezier_basis1 + lVar8 + 0x908);
      fVar268 = *(float *)(bezier_basis1 + lVar8 + 0x90c);
      fVar269 = *(float *)(bezier_basis1 + lVar8 + 0x910);
      fVar271 = *(float *)(bezier_basis1 + lVar8 + 0x914);
      local_128 = fStack_24c;
      fStack_124 = fStack_24c;
      fStack_120 = fStack_24c;
      fStack_11c = fStack_24c;
      local_118 = fStack_26c;
      fStack_114 = fStack_26c;
      fStack_110 = fStack_26c;
      fStack_10c = fStack_26c;
      fVar276 = *(float *)(bezier_basis1 + lVar8 + 0x484);
      fVar277 = *(float *)(bezier_basis1 + lVar8 + 0x488);
      fVar278 = *(float *)(bezier_basis1 + lVar8 + 0x48c);
      fVar279 = *(float *)(bezier_basis1 + lVar8 + 0x490);
      local_138 = fStack_25c;
      fStack_134 = fStack_25c;
      fStack_130 = fStack_25c;
      fStack_12c = fStack_25c;
      fVar301 = *(float *)(bezier_basis1 + lVar8);
      fVar305 = *(float *)(bezier_basis1 + lVar8 + 4);
      fVar238 = *(float *)(bezier_basis1 + lVar8 + 8);
      fVar240 = *(float *)(bezier_basis1 + lVar8 + 0xc);
      fVar218 = local_2b8 * fVar301 + local_2a8 * fVar276 + fVar236 * fVar267 + fVar104 * fVar251;
      fVar235 = local_2b8 * fVar305 + local_2a8 * fVar277 + fVar236 * fVar268 + fVar104 * fVar256;
      fVar237 = local_2b8 * fVar238 + local_2a8 * fVar278 + fVar236 * fVar269 + fVar104 * fVar258;
      fVar239 = local_2b8 * fVar240 + local_2a8 * fVar279 + fVar236 * fVar271 + fVar104 * fVar261;
      fVar63 = local_248 * fVar301 + local_308 * fVar276 + fVar241 * fVar267 + fVar108 * fVar251;
      fVar102 = local_248 * fVar305 + local_308 * fVar277 + fVar241 * fVar268 + fVar108 * fVar256;
      fVar105 = local_248 * fVar238 + local_308 * fVar278 + fVar241 * fVar269 + fVar108 * fVar258;
      fVar107 = local_248 * fVar240 + local_308 * fVar279 + fVar241 * fVar271 + fVar108 * fVar261;
      fStack_144 = local_148;
      fStack_140 = local_148;
      fStack_13c = local_148;
      auVar198._0_4_ =
           local_148 * fVar301 + fStack_25c * fVar276 + fStack_26c * fVar267 + fStack_24c * fVar251;
      auVar198._4_4_ =
           local_148 * fVar305 + fStack_25c * fVar277 + fStack_26c * fVar268 + fStack_24c * fVar256;
      auVar198._8_4_ =
           local_148 * fVar238 + fStack_25c * fVar278 + fStack_26c * fVar269 + fStack_24c * fVar258;
      auVar198._12_4_ =
           local_148 * fVar240 + fStack_25c * fVar279 + fStack_26c * fVar271 + fStack_24c * fVar261;
      fVar207 = fVar218 - fVar153;
      fVar213 = fVar235 - fVar166;
      fVar215 = fVar237 - fVar169;
      fVar216 = fVar239 - fVar171;
      fVar174 = fVar63 - (float)local_2c8._0_4_;
      fVar185 = fVar102 - (float)local_2c8._4_4_;
      fVar187 = fVar105 - fStack_2c0;
      fVar188 = fVar107 - fStack_2bc;
      fVar149 = (float)local_2c8._0_4_ * fVar207 - fVar153 * fVar174;
      fVar296 = (float)local_2c8._4_4_ * fVar213 - fVar166 * fVar185;
      fVar299 = fStack_2c0 * fVar215 - fVar169 * fVar187;
      fVar303 = fStack_2bc * fVar216 - fVar171 * fVar188;
      auVar73 = maxps(auVar273,auVar198);
      bVar34 = fVar149 * fVar149 <=
               auVar73._0_4_ * auVar73._0_4_ * (fVar207 * fVar207 + fVar174 * fVar174) &&
               0.0 < fVar61;
      bVar35 = fVar296 * fVar296 <=
               auVar73._4_4_ * auVar73._4_4_ * (fVar213 * fVar213 + fVar185 * fVar185) &&
               1.0 < fVar61;
      bVar33 = fVar299 * fVar299 <=
               auVar73._8_4_ * auVar73._8_4_ * (fVar215 * fVar215 + fVar187 * fVar187) &&
               2.0 < fVar61;
      bVar32 = 3.0 < fVar61 &&
               fVar303 * fVar303 <=
               auVar73._12_4_ * auVar73._12_4_ * (fVar216 * fVar216 + fVar188 * fVar188);
      local_428 = (float)uVar106;
      local_428 = local_428 * 4.7683716e-07;
      auVar9._4_4_ = -(uint)bVar35;
      auVar9._0_4_ = -(uint)bVar34;
      auVar9._8_4_ = -(uint)bVar33;
      auVar9._12_4_ = -(uint)bVar32;
      iVar39 = movmskps(iVar6,auVar9);
      fVar149 = *(float *)(ray + k * 4 + 0x30);
      _local_318 = ZEXT416((uint)fVar149);
      fStack_304 = local_308;
      fStack_300 = local_308;
      fStack_2fc = local_308;
      fStack_2b4 = local_2b8;
      fStack_2b0 = local_2b8;
      fStack_2ac = local_2b8;
      fStack_2a4 = local_2a8;
      fStack_2a0 = local_2a8;
      fStack_29c = local_2a8;
      local_278 = fVar214;
      fStack_274 = fVar217;
      fStack_270 = fVar234;
      local_268 = fVar165;
      fStack_264 = fVar168;
      fStack_260 = fVar212;
      fStack_244 = local_248;
      fStack_240 = local_248;
      fStack_23c = local_248;
      fStack_234 = local_238;
      fStack_230 = local_238;
      fStack_22c = local_238;
      fStack_224 = local_228;
      fStack_220 = local_228;
      fStack_21c = local_228;
      if (iVar39 != 0) {
        fVar154 = fVar251 * local_238 + fVar267 * local_228 + fVar276 * fVar152 + fVar301 * fVar205;
        fVar167 = fVar256 * local_238 + fVar268 * local_228 + fVar277 * fVar152 + fVar305 * fVar205;
        fVar170 = fVar258 * local_238 + fVar269 * local_228 + fVar278 * fVar152 + fVar238 * fVar205;
        fVar172 = fVar261 * local_238 + fVar271 * local_228 + fVar279 * fVar152 + fVar240 * fVar205;
        fVar137 = fVar147 * local_238 + fVar62 * local_228 + fVar206 * fVar152 + fVar246 * fVar205;
        fVar148 = fVar173 * local_238 + fVar133 * local_228 + fVar189 * fVar152 + fVar247 * fVar205;
        fVar150 = fVar184 * local_238 + fVar134 * local_228 + fVar204 * fVar152 + fVar249 * fVar205;
        fVar151 = fVar186 * local_238 + fVar136 * local_228 + fVar245 * fVar152 + fVar250 * fVar205;
        fVar62 = *(float *)(bezier_basis0 + lVar8 + 0x1210);
        fVar133 = *(float *)(bezier_basis0 + lVar8 + 0x1214);
        fVar134 = *(float *)(bezier_basis0 + lVar8 + 0x1218);
        fVar136 = *(float *)(bezier_basis0 + lVar8 + 0x121c);
        fVar147 = *(float *)(bezier_basis0 + lVar8 + 0x1694);
        fVar173 = *(float *)(bezier_basis0 + lVar8 + 0x1698);
        fVar184 = *(float *)(bezier_basis0 + lVar8 + 0x169c);
        fVar186 = *(float *)(bezier_basis0 + lVar8 + 0x16a0);
        fVar206 = *(float *)(bezier_basis0 + lVar8 + 0x1b18);
        fVar189 = *(float *)(bezier_basis0 + lVar8 + 0x1b1c);
        fVar204 = *(float *)(bezier_basis0 + lVar8 + 0x1b20);
        fVar245 = *(float *)(bezier_basis0 + lVar8 + 0x1b24);
        fVar246 = *(float *)(bezier_basis0 + lVar8 + 0x1f9c);
        fVar247 = *(float *)(bezier_basis0 + lVar8 + 0x1fa0);
        fVar249 = *(float *)(bezier_basis0 + lVar8 + 0x1fa4);
        fVar250 = *(float *)(bezier_basis0 + lVar8 + 0x1fa8);
        auVar15._4_4_ = local_2b8;
        auVar15._0_4_ = local_2b8;
        auVar15._8_4_ = local_2b8;
        auVar15._12_4_ = local_2b8;
        fVar252 = local_2b8 * fVar62 + local_2a8 * fVar147 + fVar236 * fVar206 + fVar104 * fVar246;
        fVar257 = local_2b8 * fVar133 + local_2a8 * fVar173 + fVar236 * fVar189 + fVar104 * fVar247;
        fVar259 = local_2b8 * fVar134 + local_2a8 * fVar184 + fVar236 * fVar204 + fVar104 * fVar249;
        fVar260 = local_2b8 * fVar136 + local_2a8 * fVar186 + fVar236 * fVar245 + fVar104 * fVar250;
        fVar294 = local_248 * fVar62 + local_308 * fVar147 + fVar241 * fVar206 + fVar108 * fVar246;
        fVar297 = local_248 * fVar133 + local_308 * fVar173 + fVar241 * fVar189 + fVar108 * fVar247;
        fVar300 = local_248 * fVar134 + local_308 * fVar184 + fVar241 * fVar204 + fVar108 * fVar249;
        fVar304 = local_248 * fVar136 + local_308 * fVar186 + fVar241 * fVar245 + fVar108 * fVar250;
        fVar251 = *(float *)(bezier_basis1 + lVar8 + 0x1210);
        fVar256 = *(float *)(bezier_basis1 + lVar8 + 0x1214);
        fVar258 = *(float *)(bezier_basis1 + lVar8 + 0x1218);
        fVar261 = *(float *)(bezier_basis1 + lVar8 + 0x121c);
        fVar267 = *(float *)(bezier_basis1 + lVar8 + 0x1b18);
        fVar268 = *(float *)(bezier_basis1 + lVar8 + 0x1b1c);
        fVar269 = *(float *)(bezier_basis1 + lVar8 + 0x1b20);
        fVar271 = *(float *)(bezier_basis1 + lVar8 + 0x1b24);
        fVar276 = *(float *)(bezier_basis1 + lVar8 + 0x1f9c);
        fVar277 = *(float *)(bezier_basis1 + lVar8 + 0x1fa0);
        fVar278 = *(float *)(bezier_basis1 + lVar8 + 0x1fa4);
        fVar279 = *(float *)(bezier_basis1 + lVar8 + 0x1fa8);
        fVar301 = *(float *)(bezier_basis1 + lVar8 + 0x1694);
        fVar305 = *(float *)(bezier_basis1 + lVar8 + 0x1698);
        fVar238 = *(float *)(bezier_basis1 + lVar8 + 0x169c);
        fVar240 = *(float *)(bezier_basis1 + lVar8 + 0x16a0);
        fVar284 = local_2b8 * fVar251 + local_2a8 * fVar301 + fVar236 * fVar267 + fVar104 * fVar276;
        fVar288 = local_2b8 * fVar256 + local_2a8 * fVar305 + fVar236 * fVar268 + fVar104 * fVar277;
        fVar290 = local_2b8 * fVar258 + local_2a8 * fVar238 + fVar236 * fVar269 + fVar104 * fVar278;
        fVar292 = local_2b8 * fVar261 + local_2a8 * fVar240 + fVar236 * fVar271 + fVar104 * fVar279;
        fVar296 = local_248 * fVar251 + local_308 * fVar301 + fVar241 * fVar267 + fVar108 * fVar276;
        fVar299 = local_248 * fVar256 + local_308 * fVar305 + fVar241 * fVar268 + fVar108 * fVar277;
        fVar303 = local_248 * fVar258 + local_308 * fVar238 + fVar241 * fVar269 + fVar108 * fVar278;
        fVar135 = local_248 * fVar261 + local_308 * fVar240 + fVar241 * fVar271 + fVar108 * fVar279;
        auVar274._0_8_ = CONCAT44(fVar257,fVar252) & 0x7fffffff7fffffff;
        auVar274._8_4_ = ABS(fVar259);
        auVar274._12_4_ = ABS(fVar260);
        auVar243._0_8_ = CONCAT44(fVar297,fVar294) & 0x7fffffff7fffffff;
        auVar243._8_4_ = ABS(fVar300);
        auVar243._12_4_ = ABS(fVar304);
        auVar73 = maxps(auVar274,auVar243);
        auVar280._0_8_ =
             CONCAT44(fVar133 * fVar205 +
                      fVar173 * fVar152 + fVar189 * local_228 + fVar247 * local_238,
                      fVar62 * fVar205 +
                      fVar147 * fVar152 + fVar206 * local_228 + fVar246 * local_238) &
             0x7fffffff7fffffff;
        auVar280._8_4_ =
             ABS(fVar134 * fVar205 + fVar184 * fVar152 + fVar204 * local_228 + fVar249 * local_238);
        auVar280._12_4_ =
             ABS(fVar136 * fVar205 + fVar186 * fVar152 + fVar245 * local_228 + fVar250 * local_238);
        auVar73 = maxps(auVar73,auVar280);
        uVar58 = -(uint)(local_428 <= auVar73._0_4_);
        uVar55 = -(uint)(local_428 <= auVar73._4_4_);
        uVar57 = -(uint)(local_428 <= auVar73._8_4_);
        uVar59 = -(uint)(local_428 <= auVar73._12_4_);
        fVar173 = (float)((uint)fVar252 & uVar58 | ~uVar58 & (uint)fVar207);
        fVar186 = (float)((uint)fVar257 & uVar55 | ~uVar55 & (uint)fVar213);
        fVar206 = (float)((uint)fVar259 & uVar57 | ~uVar57 & (uint)fVar215);
        fVar189 = (float)((uint)fVar260 & uVar59 | ~uVar59 & (uint)fVar216);
        fVar204 = (float)(~uVar58 & (uint)fVar174 | (uint)fVar294 & uVar58);
        fVar245 = (float)(~uVar55 & (uint)fVar185 | (uint)fVar297 & uVar55);
        fVar246 = (float)(~uVar57 & (uint)fVar187 | (uint)fVar300 & uVar57);
        fVar247 = (float)(~uVar59 & (uint)fVar188 | (uint)fVar304 & uVar59);
        auVar281._0_8_ = CONCAT44(fVar288,fVar284) & 0x7fffffff7fffffff;
        auVar281._8_4_ = ABS(fVar290);
        auVar281._12_4_ = ABS(fVar292);
        auVar248._0_8_ = CONCAT44(fVar299,fVar296) & 0x7fffffff7fffffff;
        auVar248._8_4_ = ABS(fVar303);
        auVar248._12_4_ = ABS(fVar135);
        auVar73 = maxps(auVar281,auVar248);
        auVar210._0_8_ =
             CONCAT44(fVar256 * fVar205 +
                      fVar305 * fVar152 + fVar268 * local_228 + fVar277 * local_238,
                      fVar251 * fVar205 +
                      fVar301 * fVar152 + fVar267 * local_228 + fVar276 * local_238) &
             0x7fffffff7fffffff;
        auVar210._8_4_ =
             ABS(fVar258 * fVar205 + fVar238 * fVar152 + fVar269 * local_228 + fVar278 * local_238);
        auVar210._12_4_ =
             ABS(fVar261 * fVar205 + fVar240 * fVar152 + fVar271 * local_228 + fVar279 * local_238);
        auVar73 = maxps(auVar73,auVar210);
        uVar58 = -(uint)(local_428 <= auVar73._0_4_);
        uVar55 = -(uint)(local_428 <= auVar73._4_4_);
        uVar57 = -(uint)(local_428 <= auVar73._8_4_);
        uVar59 = -(uint)(local_428 <= auVar73._12_4_);
        fVar258 = (float)((uint)fVar284 & uVar58 | ~uVar58 & (uint)fVar207);
        fVar261 = (float)((uint)fVar288 & uVar55 | ~uVar55 & (uint)fVar213);
        fVar267 = (float)((uint)fVar290 & uVar57 | ~uVar57 & (uint)fVar215);
        fVar268 = (float)((uint)fVar292 & uVar59 | ~uVar59 & (uint)fVar216);
        fVar249 = (float)(~uVar58 & (uint)fVar174 | (uint)fVar296 & uVar58);
        fVar250 = (float)(~uVar55 & (uint)fVar185 | (uint)fVar299 & uVar55);
        fVar251 = (float)(~uVar57 & (uint)fVar187 | (uint)fVar303 & uVar57);
        fVar256 = (float)(~uVar59 & (uint)fVar188 | (uint)fVar135 & uVar59);
        auVar116._0_4_ = fVar204 * fVar204 + fVar173 * fVar173;
        auVar116._4_4_ = fVar245 * fVar245 + fVar186 * fVar186;
        auVar116._8_4_ = fVar246 * fVar246 + fVar206 * fVar206;
        auVar116._12_4_ = fVar247 * fVar247 + fVar189 * fVar189;
        auVar73 = rsqrtps(auVar15,auVar116);
        fVar62 = auVar73._0_4_;
        fVar133 = auVar73._4_4_;
        fVar134 = auVar73._8_4_;
        fVar136 = auVar73._12_4_;
        auVar178._0_4_ = fVar62 * fVar62 * auVar116._0_4_ * 0.5 * fVar62;
        auVar178._4_4_ = fVar133 * fVar133 * auVar116._4_4_ * 0.5 * fVar133;
        auVar178._8_4_ = fVar134 * fVar134 * auVar116._8_4_ * 0.5 * fVar134;
        auVar178._12_4_ = fVar136 * fVar136 * auVar116._12_4_ * 0.5 * fVar136;
        fVar269 = fVar62 * 1.5 - auVar178._0_4_;
        fVar271 = fVar133 * 1.5 - auVar178._4_4_;
        fVar301 = fVar134 * 1.5 - auVar178._8_4_;
        fVar305 = fVar136 * 1.5 - auVar178._12_4_;
        auVar117._0_4_ = fVar249 * fVar249 + fVar258 * fVar258;
        auVar117._4_4_ = fVar250 * fVar250 + fVar261 * fVar261;
        auVar117._8_4_ = fVar251 * fVar251 + fVar267 * fVar267;
        auVar117._12_4_ = fVar256 * fVar256 + fVar268 * fVar268;
        auVar73 = rsqrtps(auVar178,auVar117);
        fVar62 = auVar73._0_4_;
        fVar133 = auVar73._4_4_;
        fVar134 = auVar73._8_4_;
        fVar136 = auVar73._12_4_;
        fVar62 = fVar62 * 1.5 - fVar62 * fVar62 * auVar117._0_4_ * 0.5 * fVar62;
        fVar147 = fVar133 * 1.5 - fVar133 * fVar133 * auVar117._4_4_ * 0.5 * fVar133;
        fVar134 = fVar134 * 1.5 - fVar134 * fVar134 * auVar117._8_4_ * 0.5 * fVar134;
        fVar184 = fVar136 * 1.5 - fVar136 * fVar136 * auVar117._12_4_ * 0.5 * fVar136;
        fVar276 = fVar204 * fVar269 * auVar273._0_4_;
        fVar277 = fVar245 * fVar271 * auVar273._4_4_;
        fVar278 = fVar246 * fVar301 * auVar273._8_4_;
        fVar279 = fVar247 * fVar305 * auVar273._12_4_;
        fVar133 = -fVar173 * fVar269 * auVar273._0_4_;
        fVar136 = -fVar186 * fVar271 * auVar273._4_4_;
        fVar173 = -fVar206 * fVar301 * auVar273._8_4_;
        fVar186 = -fVar189 * fVar305 * auVar273._12_4_;
        fVar252 = fVar269 * 0.0 * auVar273._0_4_;
        fVar257 = fVar271 * 0.0 * auVar273._4_4_;
        fVar259 = fVar301 * 0.0 * auVar273._8_4_;
        fVar260 = fVar305 * 0.0 * auVar273._12_4_;
        fVar296 = fVar249 * fVar62 * auVar198._0_4_;
        fVar299 = fVar250 * fVar147 * auVar198._4_4_;
        fVar303 = fVar251 * fVar134 * auVar198._8_4_;
        fVar135 = fVar256 * fVar184 * auVar198._12_4_;
        fVar207 = fVar218 + fVar296;
        fVar213 = fVar235 + fVar299;
        fVar215 = fVar237 + fVar303;
        fVar216 = fVar239 + fVar135;
        fVar174 = -fVar258 * fVar62 * auVar198._0_4_;
        fVar185 = -fVar261 * fVar147 * auVar198._4_4_;
        fVar187 = -fVar267 * fVar134 * auVar198._8_4_;
        fVar188 = -fVar268 * fVar184 * auVar198._12_4_;
        fVar267 = fVar63 + fVar174;
        fVar268 = fVar102 + fVar185;
        fVar269 = fVar105 + fVar187;
        fVar271 = fVar107 + fVar188;
        fVar247 = fVar62 * 0.0 * auVar198._0_4_;
        fVar250 = fVar147 * 0.0 * auVar198._4_4_;
        fVar256 = fVar134 * 0.0 * auVar198._8_4_;
        fVar261 = fVar184 * 0.0 * auVar198._12_4_;
        fVar246 = fVar153 - fVar276;
        fVar249 = fVar166 - fVar277;
        fVar251 = fVar169 - fVar278;
        fVar258 = fVar171 - fVar279;
        fVar301 = fVar154 + fVar247;
        fVar305 = fVar167 + fVar250;
        fVar238 = fVar170 + fVar256;
        fVar240 = fVar172 + fVar261;
        fVar62 = (float)local_2c8._0_4_ - fVar133;
        fVar134 = (float)local_2c8._4_4_ - fVar136;
        fVar147 = fStack_2c0 - fVar173;
        fVar184 = fStack_2bc - fVar186;
        fVar206 = fVar137 - fVar252;
        fVar189 = fVar148 - fVar257;
        fVar204 = fVar150 - fVar259;
        fVar245 = fVar151 - fVar260;
        uVar58 = -(uint)(0.0 < (fVar62 * (fVar301 - fVar206) - fVar206 * (fVar267 - fVar62)) * 0.0 +
                               (fVar206 * (fVar207 - fVar246) - (fVar301 - fVar206) * fVar246) * 0.0
                               + ((fVar267 - fVar62) * fVar246 - (fVar207 - fVar246) * fVar62));
        uVar55 = -(uint)(0.0 < (fVar134 * (fVar305 - fVar189) - fVar189 * (fVar268 - fVar134)) * 0.0
                               + (fVar189 * (fVar213 - fVar249) - (fVar305 - fVar189) * fVar249) *
                                 0.0 + ((fVar268 - fVar134) * fVar249 -
                                       (fVar213 - fVar249) * fVar134));
        uVar57 = -(uint)(0.0 < (fVar147 * (fVar238 - fVar204) - fVar204 * (fVar269 - fVar147)) * 0.0
                               + (fVar204 * (fVar215 - fVar251) - (fVar238 - fVar204) * fVar251) *
                                 0.0 + ((fVar269 - fVar147) * fVar251 -
                                       (fVar215 - fVar251) * fVar147));
        uVar59 = -(uint)(0.0 < (fVar184 * (fVar240 - fVar245) - fVar245 * (fVar271 - fVar184)) * 0.0
                               + (fVar245 * (fVar216 - fVar258) - (fVar240 - fVar245) * fVar258) *
                                 0.0 + ((fVar271 - fVar184) * fVar258 -
                                       (fVar216 - fVar258) * fVar184));
        fVar276 = (float)((uint)(fVar218 - fVar296) & uVar58 | ~uVar58 & (uint)(fVar153 + fVar276));
        fVar277 = (float)((uint)(fVar235 - fVar299) & uVar55 | ~uVar55 & (uint)(fVar166 + fVar277));
        fVar278 = (float)((uint)(fVar237 - fVar303) & uVar57 | ~uVar57 & (uint)(fVar169 + fVar278));
        fVar279 = (float)((uint)(fVar239 - fVar135) & uVar59 | ~uVar59 & (uint)(fVar171 + fVar279));
        fVar153 = (float)((uint)(fVar63 - fVar174) & uVar58 |
                         ~uVar58 & (uint)((float)local_2c8._0_4_ + fVar133));
        fVar166 = (float)((uint)(fVar102 - fVar185) & uVar55 |
                         ~uVar55 & (uint)((float)local_2c8._4_4_ + fVar136));
        fVar169 = (float)((uint)(fVar105 - fVar187) & uVar57 |
                         ~uVar57 & (uint)(fStack_2c0 + fVar173));
        fVar171 = (float)((uint)(fVar107 - fVar188) & uVar59 |
                         ~uVar59 & (uint)(fStack_2bc + fVar186));
        fVar218 = (float)((uint)(fVar154 - fVar247) & uVar58 | ~uVar58 & (uint)(fVar137 + fVar252));
        fVar235 = (float)((uint)(fVar167 - fVar250) & uVar55 | ~uVar55 & (uint)(fVar148 + fVar257));
        fVar237 = (float)((uint)(fVar170 - fVar256) & uVar57 | ~uVar57 & (uint)(fVar150 + fVar259));
        fVar239 = (float)((uint)(fVar172 - fVar261) & uVar59 | ~uVar59 & (uint)(fVar151 + fVar260));
        fVar247 = (float)((uint)fVar246 & uVar58 | ~uVar58 & (uint)fVar207);
        fVar250 = (float)((uint)fVar249 & uVar55 | ~uVar55 & (uint)fVar213);
        fVar256 = (float)((uint)fVar251 & uVar57 | ~uVar57 & (uint)fVar215);
        fVar261 = (float)((uint)fVar258 & uVar59 | ~uVar59 & (uint)fVar216);
        fVar133 = (float)((uint)fVar62 & uVar58 | ~uVar58 & (uint)fVar267);
        fVar136 = (float)((uint)fVar134 & uVar55 | ~uVar55 & (uint)fVar268);
        fVar173 = (float)((uint)fVar147 & uVar57 | ~uVar57 & (uint)fVar269);
        fVar186 = (float)((uint)fVar184 & uVar59 | ~uVar59 & (uint)fVar271);
        fVar174 = (float)((uint)fVar206 & uVar58 | ~uVar58 & (uint)fVar301);
        fVar185 = (float)((uint)fVar189 & uVar55 | ~uVar55 & (uint)fVar305);
        fVar187 = (float)((uint)fVar204 & uVar57 | ~uVar57 & (uint)fVar238);
        fVar188 = (float)((uint)fVar245 & uVar59 | ~uVar59 & (uint)fVar240);
        fVar63 = (float)((uint)fVar207 & uVar58 | ~uVar58 & (uint)fVar246) - fVar276;
        fVar102 = (float)((uint)fVar213 & uVar55 | ~uVar55 & (uint)fVar249) - fVar277;
        fVar105 = (float)((uint)fVar215 & uVar57 | ~uVar57 & (uint)fVar251) - fVar278;
        fVar107 = (float)((uint)fVar216 & uVar59 | ~uVar59 & (uint)fVar258) - fVar279;
        fVar246 = (float)((uint)fVar267 & uVar58 | ~uVar58 & (uint)fVar62) - fVar153;
        fVar249 = (float)((uint)fVar268 & uVar55 | ~uVar55 & (uint)fVar134) - fVar166;
        fVar251 = (float)((uint)fVar269 & uVar57 | ~uVar57 & (uint)fVar147) - fVar169;
        fVar258 = (float)((uint)fVar271 & uVar59 | ~uVar59 & (uint)fVar184) - fVar171;
        fVar267 = (float)((uint)fVar301 & uVar58 | ~uVar58 & (uint)fVar206) - fVar218;
        fVar268 = (float)((uint)fVar305 & uVar55 | ~uVar55 & (uint)fVar189) - fVar235;
        fVar269 = (float)((uint)fVar238 & uVar57 | ~uVar57 & (uint)fVar204) - fVar237;
        fVar271 = (float)((uint)fVar240 & uVar59 | ~uVar59 & (uint)fVar245) - fVar239;
        fVar207 = fVar276 - fVar247;
        fVar213 = fVar277 - fVar250;
        fVar215 = fVar278 - fVar256;
        fVar216 = fVar279 - fVar261;
        fVar206 = fVar153 - fVar133;
        fVar189 = fVar166 - fVar136;
        fVar204 = fVar169 - fVar173;
        fVar245 = fVar171 - fVar186;
        fVar62 = fVar218 - fVar174;
        fVar134 = fVar235 - fVar185;
        fVar147 = fVar237 - fVar187;
        fVar184 = fVar239 - fVar188;
        fVar301 = (fVar153 * fVar267 - fVar218 * fVar246) * 0.0 +
                  (fVar218 * fVar63 - fVar276 * fVar267) * 0.0 +
                  (fVar276 * fVar246 - fVar153 * fVar63);
        fVar305 = (fVar166 * fVar268 - fVar235 * fVar249) * 0.0 +
                  (fVar235 * fVar102 - fVar277 * fVar268) * 0.0 +
                  (fVar277 * fVar249 - fVar166 * fVar102);
        auVar156._4_4_ = fVar305;
        auVar156._0_4_ = fVar301;
        fVar238 = (fVar169 * fVar269 - fVar237 * fVar251) * 0.0 +
                  (fVar237 * fVar105 - fVar278 * fVar269) * 0.0 +
                  (fVar278 * fVar251 - fVar169 * fVar105);
        fVar240 = (fVar171 * fVar271 - fVar239 * fVar258) * 0.0 +
                  (fVar239 * fVar107 - fVar279 * fVar271) * 0.0 +
                  (fVar279 * fVar258 - fVar171 * fVar107);
        auVar286._0_4_ =
             (fVar133 * fVar62 - fVar174 * fVar206) * 0.0 +
             (fVar174 * fVar207 - fVar247 * fVar62) * 0.0 + (fVar247 * fVar206 - fVar133 * fVar207);
        auVar286._4_4_ =
             (fVar136 * fVar134 - fVar185 * fVar189) * 0.0 +
             (fVar185 * fVar213 - fVar250 * fVar134) * 0.0 + (fVar250 * fVar189 - fVar136 * fVar213)
        ;
        auVar286._8_4_ =
             (fVar173 * fVar147 - fVar187 * fVar204) * 0.0 +
             (fVar187 * fVar215 - fVar256 * fVar147) * 0.0 + (fVar256 * fVar204 - fVar173 * fVar215)
        ;
        auVar286._12_4_ =
             (fVar186 * fVar184 - fVar188 * fVar245) * 0.0 +
             (fVar188 * fVar216 - fVar261 * fVar184) * 0.0 + (fVar261 * fVar245 - fVar186 * fVar216)
        ;
        auVar156._8_4_ = fVar238;
        auVar156._12_4_ = fVar240;
        auVar73 = maxps(auVar156,auVar286);
        bVar34 = auVar73._0_4_ <= 0.0 && bVar34;
        auVar157._0_4_ = -(uint)bVar34;
        bVar35 = auVar73._4_4_ <= 0.0 && bVar35;
        auVar157._4_4_ = -(uint)bVar35;
        bVar33 = auVar73._8_4_ <= 0.0 && bVar33;
        auVar157._8_4_ = -(uint)bVar33;
        bVar32 = auVar73._12_4_ <= 0.0 && bVar32;
        auVar157._12_4_ = -(uint)bVar32;
        iVar39 = movmskps(iVar39,auVar157);
        if (iVar39 == 0) {
LAB_00b47b71:
          auVar158._8_8_ = uStack_320;
          auVar158._0_8_ = local_328;
        }
        else {
          auVar179._0_4_ = fVar62 * fVar246;
          auVar179._4_4_ = fVar134 * fVar249;
          auVar179._8_4_ = fVar147 * fVar251;
          auVar179._12_4_ = fVar184 * fVar258;
          fVar247 = fVar206 * fVar267 - auVar179._0_4_;
          fVar250 = fVar189 * fVar268 - auVar179._4_4_;
          fVar256 = fVar204 * fVar269 - auVar179._8_4_;
          fVar261 = fVar245 * fVar271 - auVar179._12_4_;
          fVar62 = fVar62 * fVar63 - fVar267 * fVar207;
          fVar134 = fVar134 * fVar102 - fVar268 * fVar213;
          fVar147 = fVar147 * fVar105 - fVar269 * fVar215;
          fVar184 = fVar184 * fVar107 - fVar271 * fVar216;
          fVar206 = fVar207 * fVar246 - fVar206 * fVar63;
          fVar189 = fVar213 * fVar249 - fVar189 * fVar102;
          fVar204 = fVar215 * fVar251 - fVar204 * fVar105;
          fVar245 = fVar216 * fVar258 - fVar245 * fVar107;
          auVar199._0_4_ = fVar247 * 0.0 + fVar62 * 0.0 + fVar206;
          auVar199._4_4_ = fVar250 * 0.0 + fVar134 * 0.0 + fVar189;
          auVar199._8_4_ = fVar256 * 0.0 + fVar147 * 0.0 + fVar204;
          auVar199._12_4_ = fVar261 * 0.0 + fVar184 * 0.0 + fVar245;
          auVar73 = rcpps(auVar179,auVar199);
          fVar133 = auVar73._0_4_;
          fVar136 = auVar73._4_4_;
          fVar173 = auVar73._8_4_;
          fVar186 = auVar73._12_4_;
          fVar133 = (1.0 - auVar199._0_4_ * fVar133) * fVar133 + fVar133;
          fVar136 = (1.0 - auVar199._4_4_ * fVar136) * fVar136 + fVar136;
          fVar173 = (1.0 - auVar199._8_4_ * fVar173) * fVar173 + fVar173;
          fVar186 = (1.0 - auVar199._12_4_ * fVar186) * fVar186 + fVar186;
          fVar206 = (fVar218 * fVar206 + fVar153 * fVar62 + fVar276 * fVar247) * fVar133;
          fVar134 = (fVar235 * fVar189 + fVar166 * fVar134 + fVar277 * fVar250) * fVar136;
          fVar147 = (fVar237 * fVar204 + fVar169 * fVar147 + fVar278 * fVar256) * fVar173;
          fVar184 = (fVar239 * fVar245 + fVar171 * fVar184 + fVar279 * fVar261) * fVar186;
          fVar62 = *(float *)(ray + k * 4 + 0x80);
          bVar34 = (fVar206 <= fVar62 && fVar149 <= fVar206) && bVar34;
          auVar87._0_4_ = -(uint)bVar34;
          bVar35 = (fVar134 <= fVar62 && fVar149 <= fVar134) && bVar35;
          auVar87._4_4_ = -(uint)bVar35;
          bVar33 = (fVar147 <= fVar62 && fVar149 <= fVar147) && bVar33;
          auVar87._8_4_ = -(uint)bVar33;
          bVar32 = (fVar184 <= fVar62 && fVar149 <= fVar184) && bVar32;
          auVar87._12_4_ = -(uint)bVar32;
          iVar39 = movmskps(iVar39,auVar87);
          if (iVar39 == 0) goto LAB_00b47b71;
          auVar88._0_8_ =
               CONCAT44(-(uint)(auVar199._4_4_ != 0.0 && bVar35),
                        -(uint)(auVar199._0_4_ != 0.0 && bVar34));
          auVar88._8_4_ = -(uint)(auVar199._8_4_ != 0.0 && bVar33);
          auVar88._12_4_ = -(uint)(auVar199._12_4_ != 0.0 && bVar32);
          iVar39 = movmskps(iVar39,auVar88);
          auVar158._8_8_ = uStack_320;
          auVar158._0_8_ = local_328;
          if (iVar39 != 0) {
            fVar301 = fVar301 * fVar133;
            fVar305 = fVar305 * fVar136;
            fVar238 = fVar238 * fVar173;
            fVar240 = fVar240 * fVar186;
            local_398 = (float)((uint)(1.0 - fVar301) & uVar58 | ~uVar58 & (uint)fVar301);
            fStack_394 = (float)((uint)(1.0 - fVar305) & uVar55 | ~uVar55 & (uint)fVar305);
            fStack_390 = (float)((uint)(1.0 - fVar238) & uVar57 | ~uVar57 & (uint)fVar238);
            fStack_38c = (float)((uint)(1.0 - fVar240) & uVar59 | ~uVar59 & (uint)fVar240);
            local_218 = (float)(~uVar58 & (uint)(auVar286._0_4_ * fVar133) |
                               (uint)(1.0 - auVar286._0_4_ * fVar133) & uVar58);
            fStack_214 = (float)(~uVar55 & (uint)(auVar286._4_4_ * fVar136) |
                                (uint)(1.0 - auVar286._4_4_ * fVar136) & uVar55);
            fStack_210 = (float)(~uVar57 & (uint)(auVar286._8_4_ * fVar173) |
                                (uint)(1.0 - auVar286._8_4_ * fVar173) & uVar57);
            fStack_20c = (float)(~uVar59 & (uint)(auVar286._12_4_ * fVar186) |
                                (uint)(1.0 - auVar286._12_4_ * fVar186) & uVar59);
            auVar158._8_4_ = auVar88._8_4_;
            auVar158._0_8_ = auVar88._0_8_;
            auVar158._12_4_ = auVar88._12_4_;
            local_3a8 = fVar206;
            fStack_3a4 = fVar134;
            fStack_3a0 = fVar147;
            fStack_39c = fVar184;
          }
        }
        iVar39 = movmskps(iVar39,auVar158);
        if (iVar39 != 0) {
          fVar133 = (auVar198._0_4_ - auVar273._0_4_) * local_398 + auVar273._0_4_;
          fVar134 = (auVar198._4_4_ - auVar273._4_4_) * fStack_394 + auVar273._4_4_;
          fVar136 = (auVar198._8_4_ - auVar273._8_4_) * fStack_390 + auVar273._8_4_;
          fVar147 = (auVar198._12_4_ - auVar273._12_4_) * fStack_38c + auVar273._12_4_;
          fVar62 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          local_368._0_4_ = -(uint)(fVar62 * (fVar133 + fVar133) < local_3a8) & auVar158._0_4_;
          local_368._4_4_ = -(uint)(fVar62 * (fVar134 + fVar134) < fStack_3a4) & auVar158._4_4_;
          local_368._8_4_ = -(uint)(fVar62 * (fVar136 + fVar136) < fStack_3a0) & auVar158._8_4_;
          local_368._12_4_ = -(uint)(fVar62 * (fVar147 + fVar147) < fStack_39c) & auVar158._12_4_;
          iVar39 = movmskps(iVar39,local_368);
          if (iVar39 != 0) {
            local_218 = local_218 + local_218 + -1.0;
            fStack_214 = fStack_214 + fStack_214 + -1.0;
            fStack_210 = fStack_210 + fStack_210 + -1.0;
            fStack_20c = fStack_20c + fStack_20c + -1.0;
            local_1d8 = 0;
            local_1b8 = CONCAT44(fVar168,fVar165);
            uStack_1b0 = CONCAT44(fStack_25c,fVar212);
            local_1a8 = CONCAT44(fVar217,fVar214);
            uStack_1a0 = CONCAT44(fStack_26c,fVar234);
            if ((pGVar48->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar61 = 1.0 / fVar61;
              local_178 = (anon_struct_4_6_abad0318_for_Geometry_10)(fVar61 * (local_398 + 0.0));
              fStack_174 = fVar61 * (fStack_394 + 1.0);
              fStack_170 = fVar61 * (fStack_390 + 2.0);
              fStack_16c = fVar61 * (fStack_38c + 3.0);
              local_168 = CONCAT44(fStack_214,local_218);
              uStack_160 = CONCAT44(fStack_20c,fStack_210);
              local_158[0] = local_3a8;
              local_158[1] = fStack_3a4;
              local_158[2] = fStack_3a0;
              local_158[3] = fStack_39c;
              auVar118._0_4_ = local_368._0_4_ & (uint)local_3a8;
              auVar118._4_4_ = local_368._4_4_ & (uint)fStack_3a4;
              auVar118._8_4_ = local_368._8_4_ & (uint)fStack_3a0;
              auVar118._12_4_ = local_368._12_4_ & (uint)fStack_39c;
              auVar140._0_8_ = CONCAT44(~local_368._4_4_,~local_368._0_4_) & 0x7f8000007f800000;
              auVar140._8_4_ = ~local_368._8_4_ & 0x7f800000;
              auVar140._12_4_ = ~local_368._12_4_ & 0x7f800000;
              auVar140 = auVar140 | auVar118;
              auVar159._4_4_ = auVar140._0_4_;
              auVar159._0_4_ = auVar140._4_4_;
              auVar159._8_4_ = auVar140._12_4_;
              auVar159._12_4_ = auVar140._8_4_;
              auVar73 = minps(auVar159,auVar140);
              auVar119._0_8_ = auVar73._8_8_;
              auVar119._8_4_ = auVar73._0_4_;
              auVar119._12_4_ = auVar73._4_4_;
              auVar73 = minps(auVar119,auVar73);
              auVar120._0_8_ =
                   CONCAT44(-(uint)(auVar73._4_4_ == auVar140._4_4_) & local_368._4_4_,
                            -(uint)(auVar73._0_4_ == auVar140._0_4_) & local_368._0_4_);
              auVar120._8_4_ = -(uint)(auVar73._8_4_ == auVar140._8_4_) & local_368._8_4_;
              auVar120._12_4_ = -(uint)(auVar73._12_4_ == auVar140._12_4_) & local_368._12_4_;
              iVar39 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar120);
              auVar89 = local_368;
              if (iVar39 != 0) {
                auVar89._8_4_ = auVar120._8_4_;
                auVar89._0_8_ = auVar120._0_8_;
                auVar89._12_4_ = auVar120._12_4_;
              }
              uVar58 = movmskps(iVar39,auVar89);
              lVar50 = 0;
              if (uVar58 != 0) {
                for (; (uVar58 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar48->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                aVar4 = (&local_178)[lVar50];
                uVar46 = *(undefined4 *)((long)&local_168 + lVar50 * 4);
                fVar149 = 1.0 - (float)aVar4;
                fVar62 = (float)aVar4 * fVar149 + (float)aVar4 * fVar149;
                fVar61 = fVar149 * fVar149 * -3.0;
                fVar133 = (fVar149 * fVar149 - fVar62) * 3.0;
                fVar149 = (fVar62 - (float)aVar4 * (float)aVar4) * 3.0;
                fVar62 = (float)aVar4 * (float)aVar4 * 3.0;
                *(float *)(ray + k * 4 + 0x80) = local_158[lVar50];
                *(float *)(ray + k * 4 + 0xc0) =
                     fVar61 * fVar100 + fVar133 * fVar165 + fVar149 * fVar214 + fVar62 * local_258;
                *(float *)(ray + k * 4 + 0xd0) =
                     fVar61 * fVar101 + fVar133 * fVar168 + fVar149 * fVar217 + fVar62 * fStack_254;
                *(float *)(ray + k * 4 + 0xe0) =
                     fVar61 * fVar103 + fVar133 * fVar212 + fVar149 * fVar234 + fVar62 * fStack_250;
                *(anon_struct_4_6_abad0318_for_Geometry_10 *)(ray + k * 4 + 0xf0) = aVar4;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar46;
                *(uint *)(ray + k * 4 + 0x110) = uVar56;
                *(uint *)(ray + k * 4 + 0x120) = uVar54;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_498 = (RTCPointQueryFunction)CONCAT44(uVar56,uVar56);
                uStack_490 = uVar56;
                uStack_48c = uVar56;
                uVar106 = *local_290;
                uVar14 = local_290[1];
                local_208 = local_398;
                fStack_204 = fStack_394;
                fStack_200 = fStack_390;
                fStack_1fc = fStack_38c;
                local_1f8 = local_218;
                fStack_1f4 = fStack_214;
                fStack_1f0 = fStack_210;
                fStack_1ec = fStack_20c;
                local_1e8 = local_3a8;
                fStack_1e4 = fStack_3a4;
                fStack_1e0 = fStack_3a0;
                fStack_1dc = fStack_39c;
                local_1d4 = iVar6;
                local_198 = uVar10;
                uStack_190 = uVar13;
                local_188 = local_368;
                do {
                  local_d8 = (&local_178)[lVar50];
                  uVar46 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_c8 = *(undefined4 *)((long)&local_168 + lVar50 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_158[lVar50];
                  fVar149 = 1.0 - (float)local_d8;
                  fVar62 = (float)local_d8 * fVar149 + (float)local_d8 * fVar149;
                  fVar133 = (fVar62 - (float)local_d8 * (float)local_d8) * 3.0;
                  fVar61 = (float)local_d8 * (float)local_d8 * 3.0;
                  local_3f8 = (float)uVar10;
                  fStack_3f4 = (float)((ulong)uVar10 >> 0x20);
                  fStack_3f0 = (float)uVar13;
                  fVar62 = (fVar149 * fVar149 - fVar62) * 3.0;
                  local_2f8.context = context->user;
                  fVar149 = fVar149 * fVar149 * -3.0;
                  local_108._0_4_ =
                       fVar149 * fVar100 + fVar62 * fVar165 + fVar133 * fVar214 + fVar61 * local_3f8
                  ;
                  local_f8 = fVar149 * fVar101 +
                             fVar62 * fVar168 + fVar133 * fVar217 + fVar61 * fStack_3f4;
                  local_e8 = fVar149 * fVar103 +
                             fVar62 * fVar212 + fVar133 * fVar234 + fVar61 * fStack_3f0;
                  local_108._4_4_ = local_108._0_4_;
                  fStack_100 = (float)local_108._0_4_;
                  fStack_fc = (float)local_108._0_4_;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  aStack_d4 = local_d8;
                  aStack_d0 = local_d8;
                  aStack_cc = local_d8;
                  uStack_c4 = local_c8;
                  uStack_c0 = local_c8;
                  uStack_bc = local_c8;
                  local_b8 = local_498;
                  uStack_b0 = _uStack_490;
                  local_a8 = CONCAT44(uVar54,uVar54);
                  uStack_a0 = CONCAT44(uVar54,uVar54);
                  local_98 = (local_2f8.context)->instID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_88 = (local_2f8.context)->instPrimID[0];
                  uStack_84 = local_88;
                  uStack_80 = local_88;
                  uStack_7c = local_88;
                  local_2f8.valid = (int *)&local_358;
                  pRVar49 = (RTCIntersectArguments *)pGVar48->userPtr;
                  local_2f8.hit = (RTCHitN *)local_108;
                  local_2f8.N = 4;
                  p_Var42 = pGVar48->intersectionFilterN;
                  local_358 = uVar106;
                  uStack_350 = uVar14;
                  local_2f8.geometryUserPtr = pRVar49;
                  local_2f8.ray = (RTCRayN *)ray;
                  if (p_Var42 != (RTCFilterFunctionN)0x0) {
                    p_Var42 = (RTCFilterFunctionN)(*p_Var42)(&local_2f8);
                  }
                  auVar95._0_4_ = -(uint)((int)local_358 == 0);
                  auVar95._4_4_ = -(uint)(local_358._4_4_ == 0);
                  auVar95._8_4_ = -(uint)((int)uStack_350 == 0);
                  auVar95._12_4_ = -(uint)(uStack_350._4_4_ == 0);
                  uVar58 = movmskps((int)p_Var42,auVar95);
                  pRVar43 = (RayHitK<4> *)(ulong)(uVar58 ^ 0xf);
                  if ((uVar58 ^ 0xf) == 0) {
                    auVar95 = auVar95 ^ _DAT_01febe20;
                  }
                  else {
                    pRVar49 = context->args;
                    p_Var42 = pRVar49->filter;
                    if ((p_Var42 != (RTCFilterFunctionN)0x0) &&
                       (((pRVar49->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar48->field_8).field_0x2 & 0x40) != 0)))) {
                      p_Var42 = (RTCFilterFunctionN)(*p_Var42)(&local_2f8);
                    }
                    auVar129._0_4_ = -(uint)((int)local_358 == 0);
                    auVar129._4_4_ = -(uint)(local_358._4_4_ == 0);
                    auVar129._8_4_ = -(uint)((int)uStack_350 == 0);
                    auVar129._12_4_ = -(uint)(uStack_350._4_4_ == 0);
                    auVar95 = auVar129 ^ _DAT_01febe20;
                    uVar58 = movmskps((int)p_Var42,auVar129);
                    pRVar43 = (RayHitK<4> *)(ulong)(uVar58 ^ 0xf);
                    if ((uVar58 ^ 0xf) != 0) {
                      RVar12 = *(RTCFeatureFlags *)((long)local_2f8.hit + 4);
                      uVar58 = *(uint *)((long)local_2f8.hit + 8);
                      uVar55 = *(uint *)((long)((long)local_2f8.hit + 8) + 4);
                      *(RTCRayQueryFlags *)(local_2f8.ray + 0xc0) =
                           ~auVar129._0_4_ & *(RTCRayQueryFlags *)&(local_2f8.hit)->field_0x0 |
                           *(RTCRayQueryFlags *)(local_2f8.ray + 0xc0) & auVar129._0_4_;
                      *(RTCFeatureFlags *)(local_2f8.ray + 0xc4) =
                           ~auVar129._4_4_ & RVar12 |
                           *(RTCFeatureFlags *)(local_2f8.ray + 0xc4) & auVar129._4_4_;
                      *(uint *)(local_2f8.ray + 200) =
                           ~auVar129._8_4_ & uVar58 |
                           *(uint *)(local_2f8.ray + 200) & auVar129._8_4_;
                      *(uint *)(local_2f8.ray + 0xcc) =
                           ~auVar129._12_4_ & uVar55 |
                           *(uint *)(local_2f8.ray + 0xcc) & auVar129._12_4_;
                      RVar12 = *(RTCFeatureFlags *)((long)((long)local_2f8.hit + 0x10) + 4);
                      uVar58 = *(uint *)((long)local_2f8.hit + 0x18);
                      uVar55 = *(uint *)((long)((long)local_2f8.hit + 0x18) + 4);
                      *(RTCRayQueryFlags *)(local_2f8.ray + 0xd0) =
                           ~auVar129._0_4_ & *(RTCRayQueryFlags *)((long)local_2f8.hit + 0x10) |
                           *(RTCRayQueryFlags *)(local_2f8.ray + 0xd0) & auVar129._0_4_;
                      *(RTCFeatureFlags *)(local_2f8.ray + 0xd4) =
                           ~auVar129._4_4_ & RVar12 |
                           *(RTCFeatureFlags *)(local_2f8.ray + 0xd4) & auVar129._4_4_;
                      *(uint *)(local_2f8.ray + 0xd8) =
                           ~auVar129._8_4_ & uVar58 |
                           *(uint *)(local_2f8.ray + 0xd8) & auVar129._8_4_;
                      *(uint *)(local_2f8.ray + 0xdc) =
                           ~auVar129._12_4_ & uVar55 |
                           *(uint *)(local_2f8.ray + 0xdc) & auVar129._12_4_;
                      RVar12 = ((RTCIntersectArguments *)((long)local_2f8.hit + 0x20))->feature_mask
                      ;
                      uVar58 = *(uint *)&((RTCIntersectArguments *)((long)local_2f8.hit + 0x20))->
                                         context;
                      uVar55 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_2f8.hit + 0x20))->context + 4);
                      *(RTCRayQueryFlags *)(local_2f8.ray + 0xe0) =
                           ~auVar129._0_4_ &
                           ((RTCIntersectArguments *)((long)local_2f8.hit + 0x20))->flags |
                           *(RTCRayQueryFlags *)(local_2f8.ray + 0xe0) & auVar129._0_4_;
                      *(RTCFeatureFlags *)(local_2f8.ray + 0xe4) =
                           ~auVar129._4_4_ & RVar12 |
                           *(RTCFeatureFlags *)(local_2f8.ray + 0xe4) & auVar129._4_4_;
                      *(uint *)(local_2f8.ray + 0xe8) =
                           ~auVar129._8_4_ & uVar58 |
                           *(uint *)(local_2f8.ray + 0xe8) & auVar129._8_4_;
                      *(uint *)(local_2f8.ray + 0xec) =
                           ~auVar129._12_4_ & uVar55 |
                           *(uint *)(local_2f8.ray + 0xec) & auVar129._12_4_;
                      RVar12 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_2f8.hit + 0x20))->
                                        filter + 4);
                      uVar58 = *(uint *)&((RTCIntersectArguments *)((long)local_2f8.hit + 0x20))->
                                         intersect;
                      uVar55 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_2f8.hit + 0x20))->intersect + 4);
                      *(RTCRayQueryFlags *)(local_2f8.ray + 0xf0) =
                           ~auVar129._0_4_ &
                           *(RTCRayQueryFlags *)
                            &((RTCIntersectArguments *)((long)local_2f8.hit + 0x20))->filter |
                           *(RTCRayQueryFlags *)(local_2f8.ray + 0xf0) & auVar129._0_4_;
                      *(RTCFeatureFlags *)(local_2f8.ray + 0xf4) =
                           ~auVar129._4_4_ & RVar12 |
                           *(RTCFeatureFlags *)(local_2f8.ray + 0xf4) & auVar129._4_4_;
                      *(uint *)(local_2f8.ray + 0xf8) =
                           ~auVar129._8_4_ & uVar58 |
                           *(uint *)(local_2f8.ray + 0xf8) & auVar129._8_4_;
                      *(uint *)(local_2f8.ray + 0xfc) =
                           ~auVar129._12_4_ & uVar55 |
                           *(uint *)(local_2f8.ray + 0xfc) & auVar129._12_4_;
                      RVar12 = ((RTCIntersectArguments *)((long)local_2f8.hit + 0x40))->feature_mask
                      ;
                      uVar58 = *(uint *)&((RTCIntersectArguments *)((long)local_2f8.hit + 0x40))->
                                         context;
                      uVar55 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_2f8.hit + 0x40))->context + 4);
                      *(RTCRayQueryFlags *)(local_2f8.ray + 0x100) =
                           ~auVar129._0_4_ &
                           ((RTCIntersectArguments *)((long)local_2f8.hit + 0x40))->flags |
                           *(RTCRayQueryFlags *)(local_2f8.ray + 0x100) & auVar129._0_4_;
                      *(RTCFeatureFlags *)(local_2f8.ray + 0x104) =
                           ~auVar129._4_4_ & RVar12 |
                           *(RTCFeatureFlags *)(local_2f8.ray + 0x104) & auVar129._4_4_;
                      *(uint *)(local_2f8.ray + 0x108) =
                           ~auVar129._8_4_ & uVar58 |
                           *(uint *)(local_2f8.ray + 0x108) & auVar129._8_4_;
                      *(uint *)(local_2f8.ray + 0x10c) =
                           ~auVar129._12_4_ & uVar55 |
                           *(uint *)(local_2f8.ray + 0x10c) & auVar129._12_4_;
                      RVar12 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_2f8.hit + 0x40))->
                                        filter + 4);
                      uVar58 = *(uint *)&((RTCIntersectArguments *)((long)local_2f8.hit + 0x40))->
                                         intersect;
                      uVar55 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_2f8.hit + 0x40))->intersect + 4);
                      *(RTCRayQueryFlags *)(local_2f8.ray + 0x110) =
                           *(RTCRayQueryFlags *)(local_2f8.ray + 0x110) & auVar129._0_4_ |
                           ~auVar129._0_4_ &
                           *(RTCRayQueryFlags *)
                            &((RTCIntersectArguments *)((long)local_2f8.hit + 0x40))->filter;
                      *(RTCFeatureFlags *)(local_2f8.ray + 0x114) =
                           *(RTCFeatureFlags *)(local_2f8.ray + 0x114) & auVar129._4_4_ |
                           ~auVar129._4_4_ & RVar12;
                      *(uint *)(local_2f8.ray + 0x118) =
                           *(uint *)(local_2f8.ray + 0x118) & auVar129._8_4_ |
                           ~auVar129._8_4_ & uVar58;
                      *(uint *)(local_2f8.ray + 0x11c) =
                           *(uint *)(local_2f8.ray + 0x11c) & auVar129._12_4_ |
                           ~auVar129._12_4_ & uVar55;
                      RVar12 = ((RTCIntersectArguments *)((long)local_2f8.hit + 0x60))->feature_mask
                      ;
                      uVar58 = *(uint *)&((RTCIntersectArguments *)((long)local_2f8.hit + 0x60))->
                                         context;
                      uVar55 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_2f8.hit + 0x60))->context + 4);
                      *(RTCRayQueryFlags *)(local_2f8.ray + 0x120) =
                           *(RTCRayQueryFlags *)(local_2f8.ray + 0x120) & auVar129._0_4_ |
                           ~auVar129._0_4_ &
                           ((RTCIntersectArguments *)((long)local_2f8.hit + 0x60))->flags;
                      *(RTCFeatureFlags *)(local_2f8.ray + 0x124) =
                           *(RTCFeatureFlags *)(local_2f8.ray + 0x124) & auVar129._4_4_ |
                           ~auVar129._4_4_ & RVar12;
                      *(uint *)(local_2f8.ray + 0x128) =
                           *(uint *)(local_2f8.ray + 0x128) & auVar129._8_4_ |
                           ~auVar129._8_4_ & uVar58;
                      *(uint *)(local_2f8.ray + 300) =
                           *(uint *)(local_2f8.ray + 300) & auVar129._12_4_ |
                           ~auVar129._12_4_ & uVar55;
                      RVar12 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_2f8.hit + 0x60))->
                                        filter + 4);
                      uVar58 = *(uint *)&((RTCIntersectArguments *)((long)local_2f8.hit + 0x60))->
                                         intersect;
                      uVar55 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_2f8.hit + 0x60))->intersect + 4);
                      *(RTCRayQueryFlags *)(local_2f8.ray + 0x130) =
                           ~auVar129._0_4_ &
                           *(RTCRayQueryFlags *)
                            &((RTCIntersectArguments *)((long)local_2f8.hit + 0x60))->filter |
                           *(RTCRayQueryFlags *)(local_2f8.ray + 0x130) & auVar129._0_4_;
                      *(RTCFeatureFlags *)(local_2f8.ray + 0x134) =
                           ~auVar129._4_4_ & RVar12 |
                           *(RTCFeatureFlags *)(local_2f8.ray + 0x134) & auVar129._4_4_;
                      *(uint *)(local_2f8.ray + 0x138) =
                           ~auVar129._8_4_ & uVar58 |
                           *(uint *)(local_2f8.ray + 0x138) & auVar129._8_4_;
                      *(uint *)(local_2f8.ray + 0x13c) =
                           ~auVar129._12_4_ & uVar55 |
                           *(uint *)(local_2f8.ray + 0x13c) & auVar129._12_4_;
                      RVar12 = ((RTCIntersectArguments *)((long)local_2f8.hit + 0x80))->feature_mask
                      ;
                      uVar58 = *(uint *)&((RTCIntersectArguments *)((long)local_2f8.hit + 0x80))->
                                         context;
                      uVar55 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_2f8.hit + 0x80))->context + 4);
                      *(RTCRayQueryFlags *)(local_2f8.ray + 0x140) =
                           ~auVar129._0_4_ &
                           ((RTCIntersectArguments *)((long)local_2f8.hit + 0x80))->flags |
                           *(RTCRayQueryFlags *)(local_2f8.ray + 0x140) & auVar129._0_4_;
                      *(RTCFeatureFlags *)(local_2f8.ray + 0x144) =
                           ~auVar129._4_4_ & RVar12 |
                           *(RTCFeatureFlags *)(local_2f8.ray + 0x144) & auVar129._4_4_;
                      *(uint *)(local_2f8.ray + 0x148) =
                           ~auVar129._8_4_ & uVar58 |
                           *(uint *)(local_2f8.ray + 0x148) & auVar129._8_4_;
                      *(uint *)(local_2f8.ray + 0x14c) =
                           ~auVar129._12_4_ & uVar55 |
                           *(uint *)(local_2f8.ray + 0x14c) & auVar129._12_4_;
                      pRVar43 = (RayHitK<4> *)local_2f8.ray;
                      pRVar49 = (RTCIntersectArguments *)local_2f8.hit;
                    }
                  }
                  auVar96._0_4_ = auVar95._0_4_ << 0x1f;
                  auVar96._4_4_ = auVar95._4_4_ << 0x1f;
                  auVar96._8_4_ = auVar95._8_4_ << 0x1f;
                  auVar96._12_4_ = auVar95._12_4_ << 0x1f;
                  iVar39 = movmskps((int)pRVar43,auVar96);
                  if (iVar39 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar46;
                  }
                  *(undefined4 *)(local_368 + lVar50 * 4) = 0;
                  fVar149 = *(float *)(ray + k * 4 + 0x80);
                  local_368._0_4_ = -(uint)(local_3a8 <= fVar149) & local_368._0_4_;
                  local_368._4_4_ = -(uint)(fStack_3a4 <= fVar149) & local_368._4_4_;
                  local_368._8_4_ = -(uint)(fStack_3a0 <= fVar149) & local_368._8_4_;
                  local_368._12_4_ = -(uint)(fStack_39c <= fVar149) & local_368._12_4_;
                  iVar39 = movmskps(iVar39,local_368);
                  if (iVar39 != 0) {
                    auVar130._0_4_ = local_368._0_4_ & (uint)local_3a8;
                    auVar130._4_4_ = local_368._4_4_ & (uint)fStack_3a4;
                    auVar130._8_4_ = local_368._8_4_ & (uint)fStack_3a0;
                    auVar130._12_4_ = local_368._12_4_ & (uint)fStack_39c;
                    auVar146._0_8_ =
                         CONCAT44(~local_368._4_4_,~local_368._0_4_) & 0x7f8000007f800000;
                    auVar146._8_4_ = ~local_368._8_4_ & 0x7f800000;
                    auVar146._12_4_ = ~local_368._12_4_ & 0x7f800000;
                    auVar146 = auVar146 | auVar130;
                    auVar164._4_4_ = auVar146._0_4_;
                    auVar164._0_4_ = auVar146._4_4_;
                    auVar164._8_4_ = auVar146._12_4_;
                    auVar164._12_4_ = auVar146._8_4_;
                    auVar73 = minps(auVar164,auVar146);
                    auVar131._0_8_ = auVar73._8_8_;
                    auVar131._8_4_ = auVar73._0_4_;
                    auVar131._12_4_ = auVar73._4_4_;
                    auVar73 = minps(auVar131,auVar73);
                    auVar132._0_8_ =
                         CONCAT44(-(uint)(auVar73._4_4_ == auVar146._4_4_) & local_368._4_4_,
                                  -(uint)(auVar73._0_4_ == auVar146._0_4_) & local_368._0_4_);
                    auVar132._8_4_ = -(uint)(auVar73._8_4_ == auVar146._8_4_) & local_368._8_4_;
                    auVar132._12_4_ = -(uint)(auVar73._12_4_ == auVar146._12_4_) & local_368._12_4_;
                    iVar45 = movmskps((int)pRVar49,auVar132);
                    auVar97 = local_368;
                    if (iVar45 != 0) {
                      auVar97._8_4_ = auVar132._8_4_;
                      auVar97._0_8_ = auVar132._0_8_;
                      auVar97._12_4_ = auVar132._12_4_;
                    }
                    uVar46 = movmskps(iVar45,auVar97);
                    pRVar49 = (RTCIntersectArguments *)
                              CONCAT44((int)((ulong)pRVar49 >> 0x20),uVar46);
                    lVar50 = 0;
                    if (pRVar49 != (RTCIntersectArguments *)0x0) {
                      for (; ((ulong)pRVar49 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                      }
                    }
                  }
                  iVar45 = (int)pRVar49;
                } while ((char)iVar39 != '\0');
              }
              fVar149 = (float)local_318._0_4_;
              fVar61 = (float)local_288._0_4_;
            }
          }
        }
      }
      local_288._0_4_ = fVar61;
      local_318._0_4_ = fVar149;
      if (4 < iVar6) {
        local_58 = iVar6;
        iStack_54 = iVar6;
        iStack_50 = iVar6;
        iStack_4c = iVar6;
        local_318._4_4_ = local_318._0_4_;
        fStack_310 = (float)local_318._0_4_;
        fStack_30c = (float)local_318._0_4_;
        local_288._4_4_ = 1.0 / (float)local_288._0_4_;
        local_288._0_4_ = local_288._4_4_;
        fStack_280 = (float)local_288._4_4_;
        fStack_27c = (float)local_288._4_4_;
        local_68 = uVar54;
        uStack_64 = uVar54;
        uStack_60 = uVar54;
        uStack_5c = uVar54;
        local_78 = uVar56;
        uStack_74 = uVar56;
        uStack_70 = uVar56;
        uStack_6c = uVar56;
        lVar50 = 4;
        do {
          fVar278 = fStack_250;
          fVar277 = fStack_254;
          fVar276 = local_258;
          fVar271 = fStack_260;
          fVar269 = fStack_264;
          fVar268 = local_268;
          fVar267 = fStack_270;
          fVar261 = fStack_274;
          fVar258 = local_278;
          local_1d8 = (uint)lVar50;
          pGVar48 = (Geometry *)(bezier_basis0 + lVar8);
          pauVar3 = (undefined1 (*) [12])
                    ((long)&(pGVar48->super_RefCount)._vptr_RefCount + lVar50 * 4);
          fVar149 = *(float *)*pauVar3;
          fVar61 = *(float *)(*pauVar3 + 4);
          fVar62 = *(float *)(*pauVar3 + 8);
          auVar18 = *pauVar3;
          fVar133 = *(float *)pauVar3[1];
          pfVar1 = (float *)(lVar8 + 0x2227768 + lVar50 * 4);
          fVar134 = *pfVar1;
          fVar136 = pfVar1[1];
          fVar147 = pfVar1[2];
          fVar173 = pfVar1[3];
          pfVar1 = (float *)(lVar8 + 0x2227bec + lVar50 * 4);
          fVar184 = *pfVar1;
          fVar186 = pfVar1[1];
          fVar206 = pfVar1[2];
          fVar189 = pfVar1[3];
          pauVar3 = (undefined1 (*) [12])(lVar8 + 0x2228070 + lVar50 * 4);
          fVar204 = *(float *)*pauVar3;
          fVar165 = *(float *)(*pauVar3 + 4);
          fVar168 = *(float *)(*pauVar3 + 8);
          auVar17 = *pauVar3;
          fVar212 = *(float *)pauVar3[1];
          fVar188 = local_2b8 * fVar149 +
                    local_2a8 * fVar134 + fVar236 * fVar184 + fVar104 * fVar204;
          fVar207 = fStack_2b4 * fVar61 +
                    fStack_2a4 * fVar136 + fVar236 * fVar186 + fVar104 * fVar165;
          fVar213 = fStack_2b0 * fVar62 +
                    fStack_2a0 * fVar147 + fVar236 * fVar206 + fVar104 * fVar168;
          fVar215 = fStack_2ac * fVar133 +
                    fStack_29c * fVar173 + fVar236 * fVar189 + fVar104 * fVar212;
          fVar216 = local_248 * fVar149 +
                    local_308 * fVar134 + fVar241 * fVar184 + fVar108 * fVar204;
          fVar218 = fStack_244 * fVar61 +
                    fStack_304 * fVar136 + fVar241 * fVar186 + fVar108 * fVar165;
          fVar235 = fStack_240 * fVar62 +
                    fStack_300 * fVar147 + fVar241 * fVar206 + fVar108 * fVar168;
          fVar237 = fStack_23c * fVar133 +
                    fStack_2fc * fVar173 + fVar241 * fVar189 + fVar108 * fVar212;
          fVar107 = local_148 * fVar149 +
                    local_138 * fVar134 + local_118 * fVar184 + local_128 * fVar204;
          fVar153 = fStack_144 * fVar61 +
                    fStack_134 * fVar136 + fStack_114 * fVar186 + fStack_124 * fVar165;
          auVar244._4_4_ = fVar153;
          auVar244._0_4_ = fVar107;
          fVar166 = fStack_140 * fVar62 +
                    fStack_130 * fVar147 + fStack_110 * fVar206 + fStack_120 * fVar168;
          fVar169 = fStack_13c * fVar133 +
                    fStack_12c * fVar173 + fStack_10c * fVar189 + fStack_11c * fVar212;
          pfVar1 = (float *)(bezier_basis1 + lVar8 + lVar50 * 4);
          fVar149 = *pfVar1;
          fVar61 = pfVar1[1];
          fVar62 = pfVar1[2];
          fVar204 = pfVar1[3];
          pfVar1 = (float *)(lVar8 + 0x2229b88 + lVar50 * 4);
          fVar165 = *pfVar1;
          fVar168 = pfVar1[1];
          fVar214 = pfVar1[2];
          fVar217 = pfVar1[3];
          pfVar1 = (float *)(lVar8 + 0x222a00c + lVar50 * 4);
          fVar234 = *pfVar1;
          fVar245 = pfVar1[1];
          fVar246 = pfVar1[2];
          fVar247 = pfVar1[3];
          pfVar1 = (float *)(lVar8 + 0x222a490 + lVar50 * 4);
          fVar249 = *pfVar1;
          fVar250 = pfVar1[1];
          fVar251 = pfVar1[2];
          fVar256 = pfVar1[3];
          fVar171 = local_2b8 * fVar149 +
                    local_2a8 * fVar165 + fVar236 * fVar234 + fVar104 * fVar249;
          fVar174 = fStack_2b4 * fVar61 +
                    fStack_2a4 * fVar168 + fVar236 * fVar245 + fVar104 * fVar250;
          fVar185 = fStack_2b0 * fVar62 +
                    fStack_2a0 * fVar214 + fVar236 * fVar246 + fVar104 * fVar251;
          fVar187 = fStack_2ac * fVar204 +
                    fStack_29c * fVar217 + fVar236 * fVar247 + fVar104 * fVar256;
          fVar239 = local_248 * fVar149 +
                    local_308 * fVar165 + fVar241 * fVar234 + fVar108 * fVar249;
          fVar296 = fStack_244 * fVar61 +
                    fStack_304 * fVar168 + fVar241 * fVar245 + fVar108 * fVar250;
          fVar299 = fStack_240 * fVar62 +
                    fStack_300 * fVar214 + fVar241 * fVar246 + fVar108 * fVar251;
          fVar303 = fStack_23c * fVar204 +
                    fStack_2fc * fVar217 + fVar241 * fVar247 + fVar108 * fVar256;
          auVar200._0_4_ =
               local_148 * fVar149 + local_138 * fVar165 + local_118 * fVar234 + local_128 * fVar249
          ;
          auVar200._4_4_ =
               fStack_144 * fVar61 +
               fStack_134 * fVar168 + fStack_114 * fVar245 + fStack_124 * fVar250;
          auVar200._8_4_ =
               fStack_140 * fVar62 +
               fStack_130 * fVar214 + fStack_110 * fVar246 + fStack_120 * fVar251;
          auVar200._12_4_ =
               fStack_13c * fVar204 +
               fStack_12c * fVar217 + fStack_10c * fVar247 + fStack_11c * fVar256;
          fVar151 = fVar171 - fVar188;
          fVar154 = fVar174 - fVar207;
          fVar167 = fVar185 - fVar213;
          fVar170 = fVar187 - fVar215;
          fVar135 = fVar239 - fVar216;
          fVar137 = fVar296 - fVar218;
          fVar148 = fVar299 - fVar235;
          fVar150 = fVar303 - fVar237;
          fVar279 = fVar216 * fVar151 - fVar188 * fVar135;
          fVar301 = fVar218 * fVar154 - fVar207 * fVar137;
          fVar305 = fVar235 * fVar167 - fVar213 * fVar148;
          fVar238 = fVar237 * fVar170 - fVar215 * fVar150;
          auVar244._8_4_ = fVar166;
          auVar244._12_4_ = fVar169;
          auVar73 = maxps(auVar244,auVar200);
          bVar32 = fVar279 * fVar279 <=
                   auVar73._0_4_ * auVar73._0_4_ * (fVar151 * fVar151 + fVar135 * fVar135) &&
                   (int)local_1d8 < local_58;
          auVar233._0_4_ = -(uint)bVar32;
          bVar33 = fVar301 * fVar301 <=
                   auVar73._4_4_ * auVar73._4_4_ * (fVar154 * fVar154 + fVar137 * fVar137) &&
                   (int)(local_1d8 | 1) < iStack_54;
          auVar233._4_4_ = -(uint)bVar33;
          bVar34 = fVar305 * fVar305 <=
                   auVar73._8_4_ * auVar73._8_4_ * (fVar167 * fVar167 + fVar148 * fVar148) &&
                   (int)(local_1d8 | 2) < iStack_50;
          auVar233._8_4_ = -(uint)bVar34;
          bVar35 = fVar238 * fVar238 <=
                   auVar73._12_4_ * auVar73._12_4_ * (fVar170 * fVar170 + fVar150 * fVar150) &&
                   (int)(local_1d8 | 3) < iStack_4c;
          auVar233._12_4_ = -(uint)bVar35;
          iVar39 = movmskps(iVar6,auVar233);
          fVar279 = local_338;
          fVar301 = fStack_334;
          fVar305 = fStack_330;
          fVar238 = fStack_32c;
          fVar240 = local_348;
          fVar63 = fStack_344;
          fVar102 = fStack_340;
          fVar105 = fStack_33c;
          if (iVar39 != 0) {
            fVar257 = fVar249 * local_238 + fVar234 * local_228 + fVar165 * fVar152 +
                      fVar149 * fVar205;
            fVar260 = fVar250 * fStack_234 + fVar245 * fStack_224 + fVar168 * fVar152 +
                      fVar61 * fVar205;
            fVar288 = fVar251 * fStack_230 + fVar246 * fStack_220 + fVar214 * fVar152 +
                      fVar62 * fVar205;
            fVar292 = fVar256 * fStack_22c + fVar247 * fStack_21c + fVar217 * fVar152 +
                      fVar204 * fVar205;
            local_2c8._0_4_ = auVar18._0_4_;
            local_2c8._4_4_ = auVar18._4_4_;
            fStack_2c0 = auVar18._8_4_;
            local_4a8 = auVar17._0_4_;
            fStack_4a4 = auVar17._4_4_;
            fStack_4a0 = auVar17._8_4_;
            fVar259 = local_4a8 * local_238 + fVar184 * local_228 + fVar134 * fVar152 +
                      (float)local_2c8._0_4_ * fVar205;
            fVar284 = fStack_4a4 * fStack_234 + fVar186 * fStack_224 + fVar136 * fVar152 +
                      (float)local_2c8._4_4_ * fVar205;
            fVar290 = fStack_4a0 * fStack_230 + fVar206 * fStack_220 + fVar147 * fVar152 +
                      fStack_2c0 * fVar205;
            fVar294 = fVar212 * fStack_22c + fVar189 * fStack_21c + fVar173 * fVar152 +
                      fVar133 * fVar205;
            pfVar1 = (float *)(lVar8 + 0x22284f4 + lVar50 * 4);
            fVar149 = *pfVar1;
            fVar61 = pfVar1[1];
            fVar62 = pfVar1[2];
            fVar133 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x2228978 + lVar50 * 4);
            fVar134 = *pfVar1;
            fVar136 = pfVar1[1];
            fVar147 = pfVar1[2];
            fVar173 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x2228dfc + lVar50 * 4);
            fVar184 = *pfVar1;
            fVar186 = pfVar1[1];
            fVar206 = pfVar1[2];
            fVar189 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x2229280 + lVar50 * 4);
            fVar204 = *pfVar1;
            fVar165 = pfVar1[1];
            fVar168 = pfVar1[2];
            fVar212 = pfVar1[3];
            fVar297 = local_2b8 * fVar149 +
                      local_2a8 * fVar134 + fVar236 * fVar184 + fVar104 * fVar204;
            fVar300 = fStack_2b4 * fVar61 +
                      fStack_2a4 * fVar136 + fVar236 * fVar186 + fVar104 * fVar165;
            fVar304 = fStack_2b0 * fVar62 +
                      fStack_2a0 * fVar147 + fVar236 * fVar206 + fVar104 * fVar168;
            fVar270 = fStack_2ac * fVar133 +
                      fStack_29c * fVar173 + fVar236 * fVar189 + fVar104 * fVar212;
            fVar102 = local_248 * fVar149 +
                      local_308 * fVar134 + fVar241 * fVar184 + fVar108 * fVar204;
            fVar105 = fStack_244 * fVar61 +
                      fStack_304 * fVar136 + fVar241 * fVar186 + fVar108 * fVar165;
            fVar172 = fStack_240 * fVar62 +
                      fStack_300 * fVar147 + fVar241 * fVar206 + fVar108 * fVar168;
            fVar252 = fStack_23c * fVar133 +
                      fStack_2fc * fVar173 + fVar241 * fVar189 + fVar108 * fVar212;
            pfVar1 = (float *)(lVar8 + 0x222a914 + lVar50 * 4);
            fVar214 = *pfVar1;
            fVar217 = pfVar1[1];
            fVar234 = pfVar1[2];
            fVar245 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x222b21c + lVar50 * 4);
            fVar246 = *pfVar1;
            fVar247 = pfVar1[1];
            fVar249 = pfVar1[2];
            fVar250 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x222b6a0 + lVar50 * 4);
            fVar251 = *pfVar1;
            fVar256 = pfVar1[1];
            fVar279 = pfVar1[2];
            fVar301 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x222ad98 + lVar50 * 4);
            fVar305 = *pfVar1;
            fVar238 = pfVar1[1];
            fVar240 = pfVar1[2];
            fVar63 = pfVar1[3];
            fVar285 = local_2b8 * fVar214 +
                      local_2a8 * fVar305 + fVar236 * fVar246 + fVar104 * fVar251;
            fVar289 = fStack_2b4 * fVar217 +
                      fStack_2a4 * fVar238 + fVar236 * fVar247 + fVar104 * fVar256;
            fVar291 = fStack_2b0 * fVar234 +
                      fStack_2a0 * fVar240 + fVar236 * fVar249 + fVar104 * fVar279;
            fVar293 = fStack_2ac * fVar245 +
                      fStack_29c * fVar63 + fVar236 * fVar250 + fVar104 * fVar301;
            fVar295 = local_248 * fVar214 +
                      local_308 * fVar305 + fVar241 * fVar246 + fVar108 * fVar251;
            fVar298 = fStack_244 * fVar217 +
                      fStack_304 * fVar238 + fVar241 * fVar247 + fVar108 * fVar256;
            fVar302 = fStack_240 * fVar234 +
                      fStack_300 * fVar240 + fVar241 * fVar249 + fVar108 * fVar279;
            fVar306 = fStack_23c * fVar245 +
                      fStack_2fc * fVar63 + fVar241 * fVar250 + fVar108 * fVar301;
            auVar275._0_8_ = CONCAT44(fVar300,fVar297) & 0x7fffffff7fffffff;
            auVar275._8_4_ = ABS(fVar304);
            auVar275._12_4_ = ABS(fVar270);
            auVar201._0_8_ = CONCAT44(fVar105,fVar102) & 0x7fffffff7fffffff;
            auVar201._8_4_ = ABS(fVar172);
            auVar201._12_4_ = ABS(fVar252);
            auVar73 = maxps(auVar275,auVar201);
            auVar282._0_8_ =
                 CONCAT44(fVar61 * fVar205 +
                          fVar136 * fVar152 + fVar186 * fStack_224 + fVar165 * fStack_234,
                          fVar149 * fVar205 +
                          fVar134 * fVar152 + fVar184 * local_228 + fVar204 * local_238) &
                 0x7fffffff7fffffff;
            auVar282._8_4_ =
                 ABS(fVar62 * fVar205 +
                     fVar147 * fVar152 + fVar206 * fStack_220 + fVar168 * fStack_230);
            auVar282._12_4_ =
                 ABS(fVar133 * fVar205 +
                     fVar173 * fVar152 + fVar189 * fStack_21c + fVar212 * fStack_22c);
            auVar73 = maxps(auVar73,auVar282);
            uVar58 = -(uint)(local_428 <= auVar73._0_4_);
            uVar55 = -(uint)(local_428 <= auVar73._4_4_);
            uVar57 = -(uint)(local_428 <= auVar73._8_4_);
            uVar59 = -(uint)(local_428 <= auVar73._12_4_);
            auVar202._0_4_ = ~uVar58 & (uint)fVar151;
            auVar202._4_4_ = ~uVar55 & (uint)fVar154;
            auVar202._8_4_ = ~uVar57 & (uint)fVar167;
            auVar202._12_4_ = ~uVar59 & (uint)fVar170;
            auVar266._0_4_ = (uint)fVar297 & uVar58;
            auVar266._4_4_ = (uint)fVar300 & uVar55;
            auVar266._8_4_ = (uint)fVar304 & uVar57;
            auVar266._12_4_ = (uint)fVar270 & uVar59;
            auVar266 = auVar266 | auVar202;
            fVar186 = (float)(~uVar58 & (uint)fVar135 | (uint)fVar102 & uVar58);
            fVar189 = (float)(~uVar55 & (uint)fVar137 | (uint)fVar105 & uVar55);
            fVar102 = (float)(~uVar57 & (uint)fVar148 | (uint)fVar172 & uVar57);
            fVar105 = (float)(~uVar59 & (uint)fVar150 | (uint)fVar252 & uVar59);
            auVar283._0_8_ = CONCAT44(fVar289,fVar285) & 0x7fffffff7fffffff;
            auVar283._8_4_ = ABS(fVar291);
            auVar283._12_4_ = ABS(fVar293);
            auVar141._0_8_ = CONCAT44(fVar298,fVar295) & 0x7fffffff7fffffff;
            auVar141._8_4_ = ABS(fVar302);
            auVar141._12_4_ = ABS(fVar306);
            auVar73 = maxps(auVar283,auVar141);
            auVar90._0_8_ =
                 CONCAT44(fVar217 * fVar205 +
                          fVar238 * fVar152 + fVar247 * fStack_224 + fVar256 * fStack_234,
                          fVar214 * fVar205 +
                          fVar305 * fVar152 + fVar246 * local_228 + fVar251 * local_238) &
                 0x7fffffff7fffffff;
            auVar90._8_4_ =
                 ABS(fVar234 * fVar205 +
                     fVar240 * fVar152 + fVar249 * fStack_220 + fVar279 * fStack_230);
            auVar90._12_4_ =
                 ABS(fVar245 * fVar205 +
                     fVar63 * fVar152 + fVar250 * fStack_21c + fVar301 * fStack_22c);
            auVar73 = maxps(auVar73,auVar90);
            uVar58 = -(uint)(local_428 <= auVar73._0_4_);
            uVar55 = -(uint)(local_428 <= auVar73._4_4_);
            uVar57 = -(uint)(local_428 <= auVar73._8_4_);
            uVar59 = -(uint)(local_428 <= auVar73._12_4_);
            fVar251 = (float)((uint)fVar285 & uVar58 | ~uVar58 & (uint)fVar151);
            fVar279 = (float)((uint)fVar289 & uVar55 | ~uVar55 & (uint)fVar154);
            fVar305 = (float)((uint)fVar291 & uVar57 | ~uVar57 & (uint)fVar167);
            fVar240 = (float)((uint)fVar293 & uVar59 | ~uVar59 & (uint)fVar170);
            fVar214 = (float)(~uVar58 & (uint)fVar135 | (uint)fVar295 & uVar58);
            fVar234 = (float)(~uVar55 & (uint)fVar137 | (uint)fVar298 & uVar55);
            fVar246 = (float)(~uVar57 & (uint)fVar148 | (uint)fVar302 & uVar57);
            fVar249 = (float)(~uVar59 & (uint)fVar150 | (uint)fVar306 & uVar59);
            fVar173 = auVar266._0_4_;
            fVar149 = auVar266._4_4_;
            fVar61 = auVar266._8_4_;
            fVar62 = auVar266._12_4_;
            auVar180._0_4_ = fVar186 * fVar186 + fVar173 * fVar173;
            auVar180._4_4_ = fVar189 * fVar189 + fVar149 * fVar149;
            auVar180._8_4_ = fVar102 * fVar102 + fVar61 * fVar61;
            auVar180._12_4_ = fVar105 * fVar105 + fVar62 * fVar62;
            auVar73 = rsqrtps(auVar202,auVar180);
            fVar133 = auVar73._0_4_;
            fVar134 = auVar73._4_4_;
            fVar136 = auVar73._8_4_;
            fVar147 = auVar73._12_4_;
            auVar203._0_4_ = fVar133 * fVar133 * auVar180._0_4_ * 0.5 * fVar133;
            auVar203._4_4_ = fVar134 * fVar134 * auVar180._4_4_ * 0.5 * fVar134;
            auVar203._8_4_ = fVar136 * fVar136 * auVar180._8_4_ * 0.5 * fVar136;
            auVar203._12_4_ = fVar147 * fVar147 * auVar180._12_4_ * 0.5 * fVar147;
            fVar204 = fVar133 * 1.5 - auVar203._0_4_;
            fVar165 = fVar134 * 1.5 - auVar203._4_4_;
            fVar168 = fVar136 * 1.5 - auVar203._8_4_;
            fVar212 = fVar147 * 1.5 - auVar203._12_4_;
            auVar181._0_4_ = fVar214 * fVar214 + fVar251 * fVar251;
            auVar181._4_4_ = fVar234 * fVar234 + fVar279 * fVar279;
            auVar181._8_4_ = fVar246 * fVar246 + fVar305 * fVar305;
            auVar181._12_4_ = fVar249 * fVar249 + fVar240 * fVar240;
            auVar73 = rsqrtps(auVar203,auVar181);
            fVar133 = auVar73._0_4_;
            fVar134 = auVar73._4_4_;
            fVar136 = auVar73._8_4_;
            fVar147 = auVar73._12_4_;
            fVar184 = fVar133 * 1.5 - fVar133 * fVar133 * auVar181._0_4_ * 0.5 * fVar133;
            fVar134 = fVar134 * 1.5 - fVar134 * fVar134 * auVar181._4_4_ * 0.5 * fVar134;
            fVar206 = fVar136 * 1.5 - fVar136 * fVar136 * auVar181._8_4_ * 0.5 * fVar136;
            fVar147 = fVar147 * 1.5 - fVar147 * fVar147 * auVar181._12_4_ * 0.5 * fVar147;
            fVar256 = fVar186 * fVar204 * fVar107;
            fVar301 = fVar189 * fVar165 * fVar153;
            fVar238 = fVar102 * fVar168 * fVar166;
            fVar63 = fVar105 * fVar212 * fVar169;
            fVar136 = -fVar173 * fVar204 * fVar107;
            fVar173 = -fVar149 * fVar165 * fVar153;
            fVar186 = -fVar61 * fVar168 * fVar166;
            fVar189 = -fVar62 * fVar212 * fVar169;
            fVar217 = fVar204 * 0.0 * fVar107;
            fVar245 = fVar165 * 0.0 * fVar153;
            fVar247 = fVar168 * 0.0 * fVar166;
            fVar250 = fVar212 * 0.0 * fVar169;
            fVar102 = fVar214 * fVar184 * auVar200._0_4_;
            fVar105 = fVar234 * fVar134 * auVar200._4_4_;
            fVar304 = fVar246 * fVar206 * auVar200._8_4_;
            fVar270 = fVar249 * fVar147 * auVar200._12_4_;
            fVar135 = fVar171 + fVar102;
            fVar137 = fVar174 + fVar105;
            fVar148 = fVar185 + fVar304;
            fVar150 = fVar187 + fVar270;
            fVar149 = -fVar251 * fVar184 * auVar200._0_4_;
            fVar61 = -fVar279 * fVar134 * auVar200._4_4_;
            fVar62 = -fVar305 * fVar206 * auVar200._8_4_;
            fVar133 = -fVar240 * fVar147 * auVar200._12_4_;
            fVar151 = fVar239 + fVar149;
            fVar154 = fVar296 + fVar61;
            fVar167 = fVar299 + fVar62;
            fVar170 = fVar303 + fVar133;
            fVar204 = fVar184 * 0.0 * auVar200._0_4_;
            fVar165 = fVar134 * 0.0 * auVar200._4_4_;
            fVar168 = fVar206 * 0.0 * auVar200._8_4_;
            fVar212 = fVar147 * 0.0 * auVar200._12_4_;
            fVar251 = fVar188 - fVar256;
            fVar279 = fVar207 - fVar301;
            fVar305 = fVar213 - fVar238;
            fVar240 = fVar215 - fVar63;
            fVar172 = fVar257 + fVar204;
            fVar252 = fVar260 + fVar165;
            fVar297 = fVar288 + fVar168;
            fVar300 = fVar292 + fVar212;
            fVar134 = fVar216 - fVar136;
            fVar147 = fVar218 - fVar173;
            fVar184 = fVar235 - fVar186;
            fVar206 = fVar237 - fVar189;
            fVar214 = fVar259 - fVar217;
            fVar234 = fVar284 - fVar245;
            fVar246 = fVar290 - fVar247;
            fVar249 = fVar294 - fVar250;
            uVar58 = -(uint)(0.0 < (fVar134 * (fVar172 - fVar214) - fVar214 * (fVar151 - fVar134)) *
                                   0.0 + (fVar214 * (fVar135 - fVar251) -
                                         (fVar172 - fVar214) * fVar251) * 0.0 +
                                         ((fVar151 - fVar134) * fVar251 -
                                         (fVar135 - fVar251) * fVar134));
            uVar55 = -(uint)(0.0 < (fVar147 * (fVar252 - fVar234) - fVar234 * (fVar154 - fVar147)) *
                                   0.0 + (fVar234 * (fVar137 - fVar279) -
                                         (fVar252 - fVar234) * fVar279) * 0.0 +
                                         ((fVar154 - fVar147) * fVar279 -
                                         (fVar137 - fVar279) * fVar147));
            uVar57 = -(uint)(0.0 < (fVar184 * (fVar297 - fVar246) - fVar246 * (fVar167 - fVar184)) *
                                   0.0 + (fVar246 * (fVar148 - fVar305) -
                                         (fVar297 - fVar246) * fVar305) * 0.0 +
                                         ((fVar167 - fVar184) * fVar305 -
                                         (fVar148 - fVar305) * fVar184));
            uVar59 = -(uint)(0.0 < (fVar206 * (fVar300 - fVar249) - fVar249 * (fVar170 - fVar206)) *
                                   0.0 + (fVar249 * (fVar150 - fVar240) -
                                         (fVar300 - fVar249) * fVar240) * 0.0 +
                                         ((fVar170 - fVar206) * fVar240 -
                                         (fVar150 - fVar240) * fVar206));
            fVar102 = (float)((uint)(fVar171 - fVar102) & uVar58 |
                             ~uVar58 & (uint)(fVar188 + fVar256));
            fVar105 = (float)((uint)(fVar174 - fVar105) & uVar55 |
                             ~uVar55 & (uint)(fVar207 + fVar301));
            fVar171 = (float)((uint)(fVar185 - fVar304) & uVar57 |
                             ~uVar57 & (uint)(fVar213 + fVar238));
            fVar174 = (float)((uint)(fVar187 - fVar270) & uVar59 |
                             ~uVar59 & (uint)(fVar215 + fVar63));
            fVar185 = (float)((uint)(fVar239 - fVar149) & uVar58 |
                             ~uVar58 & (uint)(fVar216 + fVar136));
            fVar187 = (float)((uint)(fVar296 - fVar61) & uVar55 |
                             ~uVar55 & (uint)(fVar218 + fVar173));
            fVar188 = (float)((uint)(fVar299 - fVar62) & uVar57 |
                             ~uVar57 & (uint)(fVar235 + fVar186));
            fVar207 = (float)((uint)(fVar303 - fVar133) & uVar59 |
                             ~uVar59 & (uint)(fVar237 + fVar189));
            fVar204 = (float)((uint)(fVar257 - fVar204) & uVar58 |
                             ~uVar58 & (uint)(fVar259 + fVar217));
            fVar165 = (float)((uint)(fVar260 - fVar165) & uVar55 |
                             ~uVar55 & (uint)(fVar284 + fVar245));
            fVar168 = (float)((uint)(fVar288 - fVar168) & uVar57 |
                             ~uVar57 & (uint)(fVar290 + fVar247));
            fVar212 = (float)((uint)(fVar292 - fVar212) & uVar59 |
                             ~uVar59 & (uint)(fVar294 + fVar250));
            fVar256 = (float)((uint)fVar251 & uVar58 | ~uVar58 & (uint)fVar135);
            fVar301 = (float)((uint)fVar279 & uVar55 | ~uVar55 & (uint)fVar137);
            fVar238 = (float)((uint)fVar305 & uVar57 | ~uVar57 & (uint)fVar148);
            fVar63 = (float)((uint)fVar240 & uVar59 | ~uVar59 & (uint)fVar150);
            fVar136 = (float)((uint)fVar134 & uVar58 | ~uVar58 & (uint)fVar151);
            fVar173 = (float)((uint)fVar147 & uVar55 | ~uVar55 & (uint)fVar154);
            fVar186 = (float)((uint)fVar184 & uVar57 | ~uVar57 & (uint)fVar167);
            fVar189 = (float)((uint)fVar206 & uVar59 | ~uVar59 & (uint)fVar170);
            fVar217 = (float)((uint)fVar214 & uVar58 | ~uVar58 & (uint)fVar172);
            fVar245 = (float)((uint)fVar234 & uVar55 | ~uVar55 & (uint)fVar252);
            fVar247 = (float)((uint)fVar246 & uVar57 | ~uVar57 & (uint)fVar297);
            fVar250 = (float)((uint)fVar249 & uVar59 | ~uVar59 & (uint)fVar300);
            fVar251 = (float)((uint)fVar135 & uVar58 | ~uVar58 & (uint)fVar251) - fVar102;
            fVar279 = (float)((uint)fVar137 & uVar55 | ~uVar55 & (uint)fVar279) - fVar105;
            fVar305 = (float)((uint)fVar148 & uVar57 | ~uVar57 & (uint)fVar305) - fVar171;
            fVar240 = (float)((uint)fVar150 & uVar59 | ~uVar59 & (uint)fVar240) - fVar174;
            fVar213 = (float)((uint)fVar151 & uVar58 | ~uVar58 & (uint)fVar134) - fVar185;
            fVar215 = (float)((uint)fVar154 & uVar55 | ~uVar55 & (uint)fVar147) - fVar187;
            fVar216 = (float)((uint)fVar167 & uVar57 | ~uVar57 & (uint)fVar184) - fVar188;
            fVar218 = (float)((uint)fVar170 & uVar59 | ~uVar59 & (uint)fVar206) - fVar207;
            fVar214 = (float)((uint)fVar172 & uVar58 | ~uVar58 & (uint)fVar214) - fVar204;
            fVar234 = (float)((uint)fVar252 & uVar55 | ~uVar55 & (uint)fVar234) - fVar165;
            fVar246 = (float)((uint)fVar297 & uVar57 | ~uVar57 & (uint)fVar246) - fVar168;
            fVar249 = (float)((uint)fVar300 & uVar59 | ~uVar59 & (uint)fVar249) - fVar212;
            fVar299 = fVar102 - fVar256;
            fVar303 = fVar105 - fVar301;
            fVar135 = fVar171 - fVar238;
            fVar137 = fVar174 - fVar63;
            fVar149 = fVar185 - fVar136;
            fVar61 = fVar187 - fVar173;
            fVar62 = fVar188 - fVar186;
            fVar133 = fVar207 - fVar189;
            fVar134 = fVar204 - fVar217;
            fVar147 = fVar165 - fVar245;
            fVar184 = fVar168 - fVar247;
            fVar206 = fVar212 - fVar250;
            fVar235 = (fVar185 * fVar214 - fVar204 * fVar213) * 0.0 +
                      (fVar204 * fVar251 - fVar102 * fVar214) * 0.0 +
                      (fVar102 * fVar213 - fVar185 * fVar251);
            fVar237 = (fVar187 * fVar234 - fVar165 * fVar215) * 0.0 +
                      (fVar165 * fVar279 - fVar105 * fVar234) * 0.0 +
                      (fVar105 * fVar215 - fVar187 * fVar279);
            auVar160._4_4_ = fVar237;
            auVar160._0_4_ = fVar235;
            fVar239 = (fVar188 * fVar246 - fVar168 * fVar216) * 0.0 +
                      (fVar168 * fVar305 - fVar171 * fVar246) * 0.0 +
                      (fVar171 * fVar216 - fVar188 * fVar305);
            fVar296 = (fVar207 * fVar249 - fVar212 * fVar218) * 0.0 +
                      (fVar212 * fVar240 - fVar174 * fVar249) * 0.0 +
                      (fVar174 * fVar218 - fVar207 * fVar240);
            auVar287._0_4_ =
                 (fVar136 * fVar134 - fVar217 * fVar149) * 0.0 +
                 (fVar217 * fVar299 - fVar256 * fVar134) * 0.0 +
                 (fVar256 * fVar149 - fVar136 * fVar299);
            auVar287._4_4_ =
                 (fVar173 * fVar147 - fVar245 * fVar61) * 0.0 +
                 (fVar245 * fVar303 - fVar301 * fVar147) * 0.0 +
                 (fVar301 * fVar61 - fVar173 * fVar303);
            auVar287._8_4_ =
                 (fVar186 * fVar184 - fVar247 * fVar62) * 0.0 +
                 (fVar247 * fVar135 - fVar238 * fVar184) * 0.0 +
                 (fVar238 * fVar62 - fVar186 * fVar135);
            auVar287._12_4_ =
                 (fVar189 * fVar206 - fVar250 * fVar133) * 0.0 +
                 (fVar250 * fVar137 - fVar63 * fVar206) * 0.0 +
                 (fVar63 * fVar133 - fVar189 * fVar137);
            auVar160._8_4_ = fVar239;
            auVar160._12_4_ = fVar296;
            auVar73 = maxps(auVar160,auVar287);
            bVar32 = auVar73._0_4_ <= 0.0 && bVar32;
            auVar161._0_4_ = -(uint)bVar32;
            bVar33 = auVar73._4_4_ <= 0.0 && bVar33;
            auVar161._4_4_ = -(uint)bVar33;
            bVar34 = auVar73._8_4_ <= 0.0 && bVar34;
            auVar161._8_4_ = -(uint)bVar34;
            bVar35 = auVar73._12_4_ <= 0.0 && bVar35;
            auVar161._12_4_ = -(uint)bVar35;
            iVar39 = movmskps((int)(bezier_basis1 + lVar8),auVar161);
            if (iVar39 == 0) {
LAB_00b48857:
              iVar39 = 0;
              auVar143._8_8_ = uStack_320;
              auVar143._0_8_ = local_328;
            }
            else {
              fVar186 = fVar149 * fVar214 - fVar134 * fVar213;
              fVar189 = fVar61 * fVar234 - fVar147 * fVar215;
              fVar217 = fVar62 * fVar246 - fVar184 * fVar216;
              fVar245 = fVar133 * fVar249 - fVar206 * fVar218;
              fVar136 = fVar134 * fVar251 - fVar214 * fVar299;
              fVar147 = fVar147 * fVar279 - fVar234 * fVar303;
              fVar173 = fVar184 * fVar305 - fVar246 * fVar135;
              fVar184 = fVar206 * fVar240 - fVar249 * fVar137;
              fVar149 = fVar299 * fVar213 - fVar149 * fVar251;
              fVar206 = fVar303 * fVar215 - fVar61 * fVar279;
              fVar214 = fVar135 * fVar216 - fVar62 * fVar305;
              fVar234 = fVar137 * fVar218 - fVar133 * fVar240;
              auVar142._0_4_ = fVar136 * 0.0 + fVar149;
              auVar142._4_4_ = fVar147 * 0.0 + fVar206;
              auVar142._8_4_ = fVar173 * 0.0 + fVar214;
              auVar142._12_4_ = fVar184 * 0.0 + fVar234;
              auVar211._0_4_ = fVar186 * 0.0 + auVar142._0_4_;
              auVar211._4_4_ = fVar189 * 0.0 + auVar142._4_4_;
              auVar211._8_4_ = fVar217 * 0.0 + auVar142._8_4_;
              auVar211._12_4_ = fVar245 * 0.0 + auVar142._12_4_;
              auVar73 = rcpps(auVar142,auVar211);
              fVar61 = auVar73._0_4_;
              fVar62 = auVar73._4_4_;
              fVar133 = auVar73._8_4_;
              fVar134 = auVar73._12_4_;
              fVar61 = (1.0 - auVar211._0_4_ * fVar61) * fVar61 + fVar61;
              fVar62 = (1.0 - auVar211._4_4_ * fVar62) * fVar62 + fVar62;
              fVar133 = (1.0 - auVar211._8_4_ * fVar133) * fVar133 + fVar133;
              fVar134 = (1.0 - auVar211._12_4_ * fVar134) * fVar134 + fVar134;
              fVar136 = (fVar204 * fVar149 + fVar185 * fVar136 + fVar102 * fVar186) * fVar61;
              fVar147 = (fVar165 * fVar206 + fVar187 * fVar147 + fVar105 * fVar189) * fVar62;
              fVar173 = (fVar168 * fVar214 + fVar188 * fVar173 + fVar171 * fVar217) * fVar133;
              fVar184 = (fVar212 * fVar234 + fVar207 * fVar184 + fVar174 * fVar245) * fVar134;
              fVar149 = *(float *)(ray + k * 4 + 0x80);
              bVar32 = ((float)local_318._0_4_ <= fVar136 && fVar136 <= fVar149) && bVar32;
              auVar182._0_4_ = -(uint)bVar32;
              bVar33 = ((float)local_318._4_4_ <= fVar147 && fVar147 <= fVar149) && bVar33;
              auVar182._4_4_ = -(uint)bVar33;
              bVar34 = (fStack_310 <= fVar173 && fVar173 <= fVar149) && bVar34;
              auVar182._8_4_ = -(uint)bVar34;
              bVar35 = (fStack_30c <= fVar184 && fVar184 <= fVar149) && bVar35;
              auVar182._12_4_ = -(uint)bVar35;
              iVar39 = movmskps(iVar39,auVar182);
              if (iVar39 == 0) goto LAB_00b48857;
              auVar183._0_8_ =
                   CONCAT44(-(uint)(auVar211._4_4_ != 0.0 && bVar33),
                            -(uint)(auVar211._0_4_ != 0.0 && bVar32));
              auVar183._8_4_ = -(uint)(auVar211._8_4_ != 0.0 && bVar34);
              auVar183._12_4_ = -(uint)(auVar211._12_4_ != 0.0 && bVar35);
              iVar39 = movmskps(iVar39,auVar183);
              auVar143._8_8_ = uStack_320;
              auVar143._0_8_ = local_328;
              if (iVar39 != 0) {
                fVar235 = fVar235 * fVar61;
                fVar237 = fVar237 * fVar62;
                fVar239 = fVar239 * fVar133;
                fVar296 = fVar296 * fVar134;
                local_338 = (float)((uint)(1.0 - fVar235) & uVar58 | ~uVar58 & (uint)fVar235);
                fStack_334 = (float)((uint)(1.0 - fVar237) & uVar55 | ~uVar55 & (uint)fVar237);
                fStack_330 = (float)((uint)(1.0 - fVar239) & uVar57 | ~uVar57 & (uint)fVar239);
                fStack_32c = (float)((uint)(1.0 - fVar296) & uVar59 | ~uVar59 & (uint)fVar296);
                local_348 = (float)(~uVar58 & (uint)(auVar287._0_4_ * fVar61) |
                                   (uint)(1.0 - auVar287._0_4_ * fVar61) & uVar58);
                fStack_344 = (float)(~uVar55 & (uint)(auVar287._4_4_ * fVar62) |
                                    (uint)(1.0 - auVar287._4_4_ * fVar62) & uVar55);
                fStack_340 = (float)(~uVar57 & (uint)(auVar287._8_4_ * fVar133) |
                                    (uint)(1.0 - auVar287._8_4_ * fVar133) & uVar57);
                fStack_33c = (float)(~uVar59 & (uint)(auVar287._12_4_ * fVar134) |
                                    (uint)(1.0 - auVar287._12_4_ * fVar134) & uVar59);
                auVar143._8_4_ = auVar183._8_4_;
                auVar143._0_8_ = auVar183._0_8_;
                auVar143._12_4_ = auVar183._12_4_;
                local_4e8 = fVar136;
                fStack_4e4 = fVar147;
                fStack_4e0 = fVar173;
                fStack_4dc = fVar184;
              }
            }
            iVar39 = movmskps(iVar39,auVar143);
            fVar279 = local_338;
            fVar301 = fStack_334;
            fVar305 = fStack_330;
            fVar238 = fStack_32c;
            fVar240 = local_348;
            fVar63 = fStack_344;
            fVar102 = fStack_340;
            fVar105 = fStack_33c;
            if (iVar39 != 0) {
              fVar107 = (auVar200._0_4_ - fVar107) * local_338 + fVar107;
              fVar153 = (auVar200._4_4_ - fVar153) * fStack_334 + fVar153;
              fVar166 = (auVar200._8_4_ - fVar166) * fStack_330 + fVar166;
              fVar169 = (auVar200._12_4_ - fVar169) * fStack_32c + fVar169;
              fVar149 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              local_368._0_4_ = -(uint)(fVar149 * (fVar107 + fVar107) < local_4e8) & auVar143._0_4_;
              local_368._4_4_ = -(uint)(fVar149 * (fVar153 + fVar153) < fStack_4e4) & auVar143._4_4_
              ;
              local_368._8_4_ = -(uint)(fVar149 * (fVar166 + fVar166) < fStack_4e0) & auVar143._8_4_
              ;
              local_368._12_4_ =
                   -(uint)(fVar149 * (fVar169 + fVar169) < fStack_4dc) & auVar143._12_4_;
              iVar39 = movmskps(iVar39,local_368);
              if (iVar39 != 0) {
                fVar240 = local_348 + local_348 + -1.0;
                fVar63 = fStack_344 + fStack_344 + -1.0;
                fVar102 = fStack_340 + fStack_340 + -1.0;
                fVar105 = fStack_33c + fStack_33c + -1.0;
                local_1b8 = CONCAT44(fStack_264,local_268);
                uStack_1b0 = CONCAT44(fStack_25c,fStack_260);
                local_1a8 = CONCAT44(fStack_274,local_278);
                uStack_1a0 = CONCAT44(fStack_26c,fStack_270);
                local_198 = CONCAT44(fStack_254,local_258);
                uStack_190 = CONCAT44(fStack_24c,fStack_250);
                pGVar7 = (context->scene->geometries).items[uVar54].ptr;
                pGVar48 = pGVar7;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar149 = (float)(int)local_1d8;
                  local_178 = (anon_struct_4_6_abad0318_for_Geometry_10)
                              ((fVar149 + local_338 + 0.0) * (float)local_288._0_4_);
                  fStack_174 = (fVar149 + fStack_334 + 1.0) * (float)local_288._4_4_;
                  fStack_170 = (fVar149 + fStack_330 + 2.0) * fStack_280;
                  fStack_16c = (fVar149 + fStack_32c + 3.0) * fStack_27c;
                  local_168 = CONCAT44(fVar63,fVar240);
                  uStack_160 = CONCAT44(fVar105,fVar102);
                  local_158[0] = local_4e8;
                  local_158[1] = fStack_4e4;
                  local_158[2] = fStack_4e0;
                  local_158[3] = fStack_4dc;
                  auVar122._0_4_ = local_368._0_4_ & (uint)local_4e8;
                  auVar122._4_4_ = local_368._4_4_ & (uint)fStack_4e4;
                  auVar122._8_4_ = local_368._8_4_ & (uint)fStack_4e0;
                  auVar122._12_4_ = local_368._12_4_ & (uint)fStack_4dc;
                  auVar144._0_8_ = CONCAT44(~local_368._4_4_,~local_368._0_4_) & 0x7f8000007f800000;
                  auVar144._8_4_ = ~local_368._8_4_ & 0x7f800000;
                  auVar144._12_4_ = ~local_368._12_4_ & 0x7f800000;
                  auVar144 = auVar144 | auVar122;
                  auVar162._4_4_ = auVar144._0_4_;
                  auVar162._0_4_ = auVar144._4_4_;
                  auVar162._8_4_ = auVar144._12_4_;
                  auVar162._12_4_ = auVar144._8_4_;
                  auVar73 = minps(auVar162,auVar144);
                  auVar123._0_8_ = auVar73._8_8_;
                  auVar123._8_4_ = auVar73._0_4_;
                  auVar123._12_4_ = auVar73._4_4_;
                  auVar73 = minps(auVar123,auVar73);
                  auVar124._0_8_ =
                       CONCAT44(-(uint)(auVar73._4_4_ == auVar144._4_4_) & local_368._4_4_,
                                -(uint)(auVar73._0_4_ == auVar144._0_4_) & local_368._0_4_);
                  auVar124._8_4_ = -(uint)(auVar73._8_4_ == auVar144._8_4_) & local_368._8_4_;
                  auVar124._12_4_ = -(uint)(auVar73._12_4_ == auVar144._12_4_) & local_368._12_4_;
                  iVar39 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar124);
                  auVar91 = local_368;
                  if (iVar39 != 0) {
                    auVar91._8_4_ = auVar124._8_4_;
                    auVar91._0_8_ = auVar124._0_8_;
                    auVar91._12_4_ = auVar124._12_4_;
                  }
                  uVar58 = movmskps(iVar39,auVar91);
                  lVar52 = 0;
                  if (uVar58 != 0) {
                    for (; (uVar58 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    aVar4 = (&local_178)[lVar52];
                    uVar46 = *(undefined4 *)((long)&local_168 + lVar52 * 4);
                    fVar149 = 1.0 - (float)aVar4;
                    fVar62 = (float)aVar4 * fVar149 + (float)aVar4 * fVar149;
                    fVar61 = fVar149 * fVar149 * -3.0;
                    fVar133 = (fVar149 * fVar149 - fVar62) * 3.0;
                    fVar149 = (fVar62 - (float)aVar4 * (float)aVar4) * 3.0;
                    fVar62 = (float)aVar4 * (float)aVar4 * 3.0;
                    *(float *)(ray + k * 4 + 0x80) = local_158[lVar52];
                    *(float *)(ray + k * 4 + 0xc0) =
                         fVar61 * fVar100 +
                         fVar133 * local_268 + fVar149 * local_278 + fVar62 * local_258;
                    *(float *)(ray + k * 4 + 0xd0) =
                         fVar61 * fVar101 +
                         fVar133 * fStack_264 + fVar149 * fStack_274 + fVar62 * fStack_254;
                    *(float *)(ray + k * 4 + 0xe0) =
                         fVar61 * fVar103 +
                         fVar133 * fStack_260 + fVar149 * fStack_270 + fVar62 * fStack_250;
                    *(anon_struct_4_6_abad0318_for_Geometry_10 *)(ray + k * 4 + 0xf0) = aVar4;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar46;
                    *(uint *)(ray + k * 4 + 0x110) = uVar56;
                    *(uint *)(ray + k * 4 + 0x120) = uVar54;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    uVar10 = *local_290;
                    uVar13 = local_290[1];
                    local_348 = fVar240;
                    fStack_344 = fVar63;
                    fStack_340 = fVar102;
                    fStack_33c = fVar105;
                    _local_2c8 = auVar233;
                    local_208 = local_338;
                    fStack_204 = fStack_334;
                    fStack_200 = fStack_330;
                    fStack_1fc = fStack_32c;
                    local_1f8 = fVar240;
                    fStack_1f4 = fVar63;
                    fStack_1f0 = fVar102;
                    fStack_1ec = fVar105;
                    local_1e8 = local_4e8;
                    fStack_1e4 = fStack_4e4;
                    fStack_1e0 = fStack_4e0;
                    fStack_1dc = fStack_4dc;
                    local_1d4 = iVar6;
                    local_1c8 = uVar36;
                    uStack_1c0 = uVar37;
                    local_188 = local_368;
                    do {
                      local_d8 = (&local_178)[lVar52];
                      uVar46 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_c8 = *(undefined4 *)((long)&local_168 + lVar52 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_158[lVar52];
                      fVar149 = 1.0 - (float)local_d8;
                      fVar62 = (float)local_d8 * fVar149 + (float)local_d8 * fVar149;
                      fVar133 = (fVar62 - (float)local_d8 * (float)local_d8) * 3.0;
                      fVar61 = (float)local_d8 * (float)local_d8 * 3.0;
                      fVar62 = (fVar149 * fVar149 - fVar62) * 3.0;
                      local_2f8.context = context->user;
                      fVar149 = fVar149 * fVar149 * -3.0;
                      local_108._0_4_ =
                           fVar149 * fVar100 +
                           fVar62 * fVar268 + fVar133 * fVar258 + fVar61 * fVar276;
                      local_f8 = fVar149 * fVar101 +
                                 fVar62 * fVar269 + fVar133 * fVar261 + fVar61 * fVar277;
                      local_e8 = fVar149 * fVar103 +
                                 fVar62 * fVar271 + fVar133 * fVar267 + fVar61 * fVar278;
                      local_108._4_4_ = local_108._0_4_;
                      fStack_100 = (float)local_108._0_4_;
                      fStack_fc = (float)local_108._0_4_;
                      fStack_f4 = local_f8;
                      fStack_f0 = local_f8;
                      fStack_ec = local_f8;
                      fStack_e4 = local_e8;
                      fStack_e0 = local_e8;
                      fStack_dc = local_e8;
                      aStack_d4 = local_d8;
                      aStack_d0 = local_d8;
                      aStack_cc = local_d8;
                      uStack_c4 = local_c8;
                      uStack_c0 = local_c8;
                      uStack_bc = local_c8;
                      uStack_b0._4_4_ = uStack_6c;
                      uStack_b0._0_4_ = uStack_70;
                      local_b8 = (RTCPointQueryFunction)CONCAT44(uStack_74,local_78);
                      local_a8 = CONCAT44(uStack_64,local_68);
                      uStack_a0 = CONCAT44(uStack_5c,uStack_60);
                      local_98 = (local_2f8.context)->instID[0];
                      uStack_94 = local_98;
                      uStack_90 = local_98;
                      uStack_8c = local_98;
                      local_88 = (local_2f8.context)->instPrimID[0];
                      uStack_84 = local_88;
                      uStack_80 = local_88;
                      uStack_7c = local_88;
                      local_2f8.valid = (int *)&local_358;
                      local_2f8.geometryUserPtr = pGVar7->userPtr;
                      local_2f8.hit = (RTCHitN *)local_108;
                      local_2f8.N = 4;
                      p_Var42 = pGVar7->intersectionFilterN;
                      pGVar48 = pGVar7;
                      local_358 = uVar10;
                      uStack_350 = uVar13;
                      local_2f8.ray = (RTCRayN *)ray;
                      if (p_Var42 != (RTCFilterFunctionN)0x0) {
                        p_Var42 = (RTCFilterFunctionN)(*p_Var42)(&local_2f8);
                        fVar279 = local_338;
                        fVar301 = fStack_334;
                        fVar305 = fStack_330;
                        fVar238 = fStack_32c;
                        fVar240 = local_348;
                        fVar63 = fStack_344;
                        fVar102 = fStack_340;
                        fVar105 = fStack_33c;
                      }
                      auVar92._0_4_ = -(uint)((int)local_358 == 0);
                      auVar92._4_4_ = -(uint)(local_358._4_4_ == 0);
                      auVar92._8_4_ = -(uint)((int)uStack_350 == 0);
                      auVar92._12_4_ = -(uint)(uStack_350._4_4_ == 0);
                      uVar58 = movmskps((int)p_Var42,auVar92);
                      pRVar43 = (RayHitK<4> *)(ulong)(uVar58 ^ 0xf);
                      if ((uVar58 ^ 0xf) == 0) {
                        auVar92 = auVar92 ^ _DAT_01febe20;
                      }
                      else {
                        pGVar48 = (Geometry *)context->args;
                        pDVar44 = pGVar48->device;
                        if ((pDVar44 != (Device *)0x0) &&
                           ((((ulong)(pGVar48->super_RefCount)._vptr_RefCount & 2) != 0 ||
                            (pGVar48 = pGVar7, ((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          pDVar44 = (Device *)(*(code *)pDVar44)(&local_2f8);
                          fVar279 = local_338;
                          fVar301 = fStack_334;
                          fVar305 = fStack_330;
                          fVar238 = fStack_32c;
                          fVar240 = local_348;
                          fVar63 = fStack_344;
                          fVar102 = fStack_340;
                          fVar105 = fStack_33c;
                        }
                        auVar125._0_4_ = -(uint)((int)local_358 == 0);
                        auVar125._4_4_ = -(uint)(local_358._4_4_ == 0);
                        auVar125._8_4_ = -(uint)((int)uStack_350 == 0);
                        auVar125._12_4_ = -(uint)(uStack_350._4_4_ == 0);
                        auVar92 = auVar125 ^ _DAT_01febe20;
                        uVar58 = movmskps((int)pDVar44,auVar125);
                        pRVar43 = (RayHitK<4> *)(ulong)(uVar58 ^ 0xf);
                        if ((uVar58 ^ 0xf) != 0) {
                          uVar58 = *(uint *)((long)&((RefCount *)&(local_2f8.hit)->field_0x0)->
                                                    _vptr_RefCount + 4);
                          _Var38 = (((RefCount *)&(local_2f8.hit)->field_0x0)->refCounter).
                                   super___atomic_base<unsigned_long>._M_i;
                          uVar55 = *(uint *)((long)&(((RefCount *)&(local_2f8.hit)->field_0x0)->
                                                    refCounter).super___atomic_base<unsigned_long>.
                                                    _M_i + 4);
                          *(uint *)(local_2f8.ray + 0xc0) =
                               ~auVar125._0_4_ &
                               *(uint *)&((RefCount *)&(local_2f8.hit)->field_0x0)->_vptr_RefCount |
                               *(uint *)(local_2f8.ray + 0xc0) & auVar125._0_4_;
                          *(uint *)(local_2f8.ray + 0xc4) =
                               ~auVar125._4_4_ & uVar58 |
                               *(uint *)(local_2f8.ray + 0xc4) & auVar125._4_4_;
                          *(uint *)(local_2f8.ray + 200) =
                               ~auVar125._8_4_ & (uint)_Var38 |
                               *(uint *)(local_2f8.ray + 200) & auVar125._8_4_;
                          *(uint *)(local_2f8.ray + 0xcc) =
                               ~auVar125._12_4_ & uVar55 |
                               *(uint *)(local_2f8.ray + 0xcc) & auVar125._12_4_;
                          uVar58 = *(uint *)((long)((long)local_2f8.hit + 0x10) + 4);
                          uVar55 = *(uint *)((long)local_2f8.hit + 0x18);
                          uVar57 = *(uint *)((long)((long)local_2f8.hit + 0x18) + 4);
                          *(uint *)(local_2f8.ray + 0xd0) =
                               ~auVar125._0_4_ & *(uint *)((long)local_2f8.hit + 0x10) |
                               *(uint *)(local_2f8.ray + 0xd0) & auVar125._0_4_;
                          *(uint *)(local_2f8.ray + 0xd4) =
                               ~auVar125._4_4_ & uVar58 |
                               *(uint *)(local_2f8.ray + 0xd4) & auVar125._4_4_;
                          *(uint *)(local_2f8.ray + 0xd8) =
                               ~auVar125._8_4_ & uVar55 |
                               *(uint *)(local_2f8.ray + 0xd8) & auVar125._8_4_;
                          *(uint *)(local_2f8.ray + 0xdc) =
                               ~auVar125._12_4_ & uVar57 |
                               *(uint *)(local_2f8.ray + 0xdc) & auVar125._12_4_;
                          uVar58 = *(uint *)((long)local_2f8.hit + 0x24);
                          fVar149 = *(float *)((long)local_2f8.hit + 0x28);
                          fVar61 = ((BBox1f *)((long)local_2f8.hit + 0x2c))->lower;
                          *(uint *)(local_2f8.ray + 0xe0) =
                               ~auVar125._0_4_ & *(uint *)((long)local_2f8.hit + 0x20) |
                               *(uint *)(local_2f8.ray + 0xe0) & auVar125._0_4_;
                          *(uint *)(local_2f8.ray + 0xe4) =
                               ~auVar125._4_4_ & uVar58 |
                               *(uint *)(local_2f8.ray + 0xe4) & auVar125._4_4_;
                          *(uint *)(local_2f8.ray + 0xe8) =
                               ~auVar125._8_4_ & (uint)fVar149 |
                               *(uint *)(local_2f8.ray + 0xe8) & auVar125._8_4_;
                          *(uint *)(local_2f8.ray + 0xec) =
                               ~auVar125._12_4_ & (uint)fVar61 |
                               *(uint *)(local_2f8.ray + 0xec) & auVar125._12_4_;
                          uVar58 = *(uint *)((long)local_2f8.hit + 0x34);
                          uVar55 = *(uint *)((long)local_2f8.hit + 0x38);
                          aVar4 = *(anon_struct_4_6_abad0318_for_Geometry_10 *)
                                   ((long)local_2f8.hit + 0x3c);
                          *(uint *)(local_2f8.ray + 0xf0) =
                               ~auVar125._0_4_ &
                               (uint)((BBox1f *)((long)local_2f8.hit + 0x2c))->upper |
                               *(uint *)(local_2f8.ray + 0xf0) & auVar125._0_4_;
                          *(uint *)(local_2f8.ray + 0xf4) =
                               ~auVar125._4_4_ & uVar58 |
                               *(uint *)(local_2f8.ray + 0xf4) & auVar125._4_4_;
                          *(uint *)(local_2f8.ray + 0xf8) =
                               ~auVar125._8_4_ & uVar55 |
                               *(uint *)(local_2f8.ray + 0xf8) & auVar125._8_4_;
                          *(uint *)(local_2f8.ray + 0xfc) =
                               ~auVar125._12_4_ & (uint)aVar4 |
                               *(uint *)(local_2f8.ray + 0xfc) & auVar125._12_4_;
                          uVar58 = *(uint *)((long)((long)local_2f8.hit + 0x40) + 4);
                          uVar55 = *(uint *)((long)local_2f8.hit + 0x48);
                          uVar57 = *(uint *)((long)((long)local_2f8.hit + 0x48) + 4);
                          *(uint *)(local_2f8.ray + 0x100) =
                               ~auVar125._0_4_ & *(uint *)((long)local_2f8.hit + 0x40) |
                               *(uint *)(local_2f8.ray + 0x100) & auVar125._0_4_;
                          *(uint *)(local_2f8.ray + 0x104) =
                               ~auVar125._4_4_ & uVar58 |
                               *(uint *)(local_2f8.ray + 0x104) & auVar125._4_4_;
                          *(uint *)(local_2f8.ray + 0x108) =
                               ~auVar125._8_4_ & uVar55 |
                               *(uint *)(local_2f8.ray + 0x108) & auVar125._8_4_;
                          *(uint *)(local_2f8.ray + 0x10c) =
                               ~auVar125._12_4_ & uVar57 |
                               *(uint *)(local_2f8.ray + 0x10c) & auVar125._12_4_;
                          uVar58 = *(uint *)((long)((long)local_2f8.hit + 0x50) + 4);
                          uVar55 = *(uint *)((long)local_2f8.hit + 0x58);
                          uVar57 = *(uint *)((long)local_2f8.hit + 0x5c);
                          *(uint *)(local_2f8.ray + 0x110) =
                               *(uint *)(local_2f8.ray + 0x110) & auVar125._0_4_ |
                               ~auVar125._0_4_ & *(uint *)((long)local_2f8.hit + 0x50);
                          *(uint *)(local_2f8.ray + 0x114) =
                               *(uint *)(local_2f8.ray + 0x114) & auVar125._4_4_ |
                               ~auVar125._4_4_ & uVar58;
                          *(uint *)(local_2f8.ray + 0x118) =
                               *(uint *)(local_2f8.ray + 0x118) & auVar125._8_4_ |
                               ~auVar125._8_4_ & uVar55;
                          *(uint *)(local_2f8.ray + 0x11c) =
                               *(uint *)(local_2f8.ray + 0x11c) & auVar125._12_4_ |
                               ~auVar125._12_4_ & uVar57;
                          uVar58 = *(uint *)((long)&(((Geometry *)((long)local_2f8.hit + 0x60))->
                                                    super_RefCount)._vptr_RefCount + 4);
                          _Var38 = (((Geometry *)((long)local_2f8.hit + 0x60))->super_RefCount).
                                   refCounter.super___atomic_base<unsigned_long>._M_i;
                          uVar55 = *(uint *)((long)&(((Geometry *)((long)local_2f8.hit + 0x60))->
                                                    super_RefCount).refCounter.
                                                    super___atomic_base<unsigned_long>._M_i + 4);
                          *(uint *)(local_2f8.ray + 0x120) =
                               *(uint *)(local_2f8.ray + 0x120) & auVar125._0_4_ |
                               ~auVar125._0_4_ &
                               *(uint *)&(((Geometry *)((long)local_2f8.hit + 0x60))->super_RefCount
                                         )._vptr_RefCount;
                          *(uint *)(local_2f8.ray + 0x124) =
                               *(uint *)(local_2f8.ray + 0x124) & auVar125._4_4_ |
                               ~auVar125._4_4_ & uVar58;
                          *(uint *)(local_2f8.ray + 0x128) =
                               *(uint *)(local_2f8.ray + 0x128) & auVar125._8_4_ |
                               ~auVar125._8_4_ & (uint)_Var38;
                          *(uint *)(local_2f8.ray + 300) =
                               *(uint *)(local_2f8.ray + 300) & auVar125._12_4_ |
                               ~auVar125._12_4_ & uVar55;
                          uVar58 = *(uint *)((long)&((Geometry *)((long)local_2f8.hit + 0x60))->
                                                    device + 4);
                          uVar55 = *(uint *)&((Geometry *)((long)local_2f8.hit + 0x60))->userPtr;
                          uVar57 = *(uint *)((long)&((Geometry *)((long)local_2f8.hit + 0x60))->
                                                    userPtr + 4);
                          *(uint *)(local_2f8.ray + 0x130) =
                               ~auVar125._0_4_ &
                               *(uint *)&((Geometry *)((long)local_2f8.hit + 0x60))->device |
                               *(uint *)(local_2f8.ray + 0x130) & auVar125._0_4_;
                          *(uint *)(local_2f8.ray + 0x134) =
                               ~auVar125._4_4_ & uVar58 |
                               *(uint *)(local_2f8.ray + 0x134) & auVar125._4_4_;
                          *(uint *)(local_2f8.ray + 0x138) =
                               ~auVar125._8_4_ & uVar55 |
                               *(uint *)(local_2f8.ray + 0x138) & auVar125._8_4_;
                          *(uint *)(local_2f8.ray + 0x13c) =
                               ~auVar125._12_4_ & uVar57 |
                               *(uint *)(local_2f8.ray + 0x13c) & auVar125._12_4_;
                          uVar58 = ((Geometry *)((long)local_2f8.hit + 0x60))->numTimeSteps;
                          fVar149 = ((Geometry *)((long)local_2f8.hit + 0x60))->fnumTimeSegments;
                          fVar61 = (((Geometry *)((long)local_2f8.hit + 0x60))->time_range).lower;
                          *(uint *)(local_2f8.ray + 0x140) =
                               ~auVar125._0_4_ &
                               ((Geometry *)((long)local_2f8.hit + 0x60))->numPrimitives |
                               *(uint *)(local_2f8.ray + 0x140) & auVar125._0_4_;
                          *(uint *)(local_2f8.ray + 0x144) =
                               ~auVar125._4_4_ & uVar58 |
                               *(uint *)(local_2f8.ray + 0x144) & auVar125._4_4_;
                          *(uint *)(local_2f8.ray + 0x148) =
                               ~auVar125._8_4_ & (uint)fVar149 |
                               *(uint *)(local_2f8.ray + 0x148) & auVar125._8_4_;
                          *(uint *)(local_2f8.ray + 0x14c) =
                               ~auVar125._12_4_ & (uint)fVar61 |
                               *(uint *)(local_2f8.ray + 0x14c) & auVar125._12_4_;
                          pRVar43 = (RayHitK<4> *)local_2f8.ray;
                          pGVar48 = (Geometry *)local_2f8.hit;
                        }
                      }
                      auVar93._0_4_ = auVar92._0_4_ << 0x1f;
                      auVar93._4_4_ = auVar92._4_4_ << 0x1f;
                      auVar93._8_4_ = auVar92._8_4_ << 0x1f;
                      auVar93._12_4_ = auVar92._12_4_ << 0x1f;
                      iVar39 = movmskps((int)pRVar43,auVar93);
                      if (iVar39 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar46;
                      }
                      *(undefined4 *)(local_368 + lVar52 * 4) = 0;
                      fVar149 = *(float *)(ray + k * 4 + 0x80);
                      local_368._0_4_ = -(uint)(local_4e8 <= fVar149) & local_368._0_4_;
                      local_368._4_4_ = -(uint)(fStack_4e4 <= fVar149) & local_368._4_4_;
                      local_368._8_4_ = -(uint)(fStack_4e0 <= fVar149) & local_368._8_4_;
                      local_368._12_4_ = -(uint)(fStack_4dc <= fVar149) & local_368._12_4_;
                      iVar39 = movmskps(iVar39,local_368);
                      if (iVar39 != 0) {
                        auVar126._0_4_ = local_368._0_4_ & (uint)local_4e8;
                        auVar126._4_4_ = local_368._4_4_ & (uint)fStack_4e4;
                        auVar126._8_4_ = local_368._8_4_ & (uint)fStack_4e0;
                        auVar126._12_4_ = local_368._12_4_ & (uint)fStack_4dc;
                        auVar145._0_8_ =
                             CONCAT44(~local_368._4_4_,~local_368._0_4_) & 0x7f8000007f800000;
                        auVar145._8_4_ = ~local_368._8_4_ & 0x7f800000;
                        auVar145._12_4_ = ~local_368._12_4_ & 0x7f800000;
                        auVar145 = auVar145 | auVar126;
                        auVar163._4_4_ = auVar145._0_4_;
                        auVar163._0_4_ = auVar145._4_4_;
                        auVar163._8_4_ = auVar145._12_4_;
                        auVar163._12_4_ = auVar145._8_4_;
                        auVar73 = minps(auVar163,auVar145);
                        auVar127._0_8_ = auVar73._8_8_;
                        auVar127._8_4_ = auVar73._0_4_;
                        auVar127._12_4_ = auVar73._4_4_;
                        auVar73 = minps(auVar127,auVar73);
                        auVar128._0_8_ =
                             CONCAT44(-(uint)(auVar73._4_4_ == auVar145._4_4_) & local_368._4_4_,
                                      -(uint)(auVar73._0_4_ == auVar145._0_4_) & local_368._0_4_);
                        auVar128._8_4_ = -(uint)(auVar73._8_4_ == auVar145._8_4_) & local_368._8_4_;
                        auVar128._12_4_ =
                             -(uint)(auVar73._12_4_ == auVar145._12_4_) & local_368._12_4_;
                        iVar45 = movmskps((int)pGVar48,auVar128);
                        auVar94 = local_368;
                        if (iVar45 != 0) {
                          auVar94._8_4_ = auVar128._8_4_;
                          auVar94._0_8_ = auVar128._0_8_;
                          auVar94._12_4_ = auVar128._12_4_;
                        }
                        uVar46 = movmskps(iVar45,auVar94);
                        pGVar48 = (Geometry *)CONCAT44((int)((ulong)pGVar48 >> 0x20),uVar46);
                        lVar52 = 0;
                        if (pGVar48 != (Geometry *)0x0) {
                          for (; ((ulong)pGVar48 >> lVar52 & 1) == 0; lVar52 = lVar52 + 1) {
                          }
                        }
                      }
                    } while ((char)iVar39 != '\0');
                  }
                }
              }
            }
          }
          iVar45 = (int)pGVar48;
          lVar50 = lVar50 + 4;
          local_348 = fVar240;
          fStack_344 = fVar63;
          fStack_340 = fVar102;
          fStack_33c = fVar105;
          local_338 = fVar279;
          fStack_334 = fVar301;
          fStack_330 = fVar305;
          fStack_32c = fVar238;
        } while ((int)lVar50 < iVar6);
      }
      fVar149 = *(float *)(ray + k * 4 + 0x80);
      auVar121._4_4_ = -(uint)(fStack_44 <= fVar149);
      auVar121._0_4_ = -(uint)(local_48 <= fVar149);
      auVar121._8_4_ = -(uint)(fStack_40 <= fVar149);
      auVar121._12_4_ = -(uint)(fStack_3c <= fVar149);
      uVar54 = movmskps(iVar45,auVar121);
      uVar53 = uVar53 & uVar53 + 0xf & uVar54;
    } while (uVar53 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }